

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O1

int __thiscall amrex::EB2::Level::coarsenFromFine(Level *this,Level *fineLevel,bool fill_boundary)

{
  DistributionMapping *dm;
  MultiFab *this_00;
  long *plVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  BoxArray *ba;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  element_type *peVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  byte bVar19;
  IndexType IVar20;
  byte bVar21;
  byte bVar22;
  EBCellFlag *pEVar23;
  Long LVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  int i;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  double *pdVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  byte bVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  long lVar55;
  long lVar56;
  bool bVar57;
  char cVar58;
  uint uVar59;
  uint uVar60;
  int iVar61;
  undefined7 in_register_00000011;
  long lVar62;
  bool bVar63;
  char cVar64;
  undefined1 uVar65;
  BoxArray *this_01;
  long lVar66;
  double *pdVar67;
  byte bVar68;
  int iVar69;
  bool bVar71;
  char cVar72;
  int iVar73;
  bool bVar74;
  int iVar75;
  long lVar76;
  bool bVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  long lVar83;
  bool bVar84;
  char cVar85;
  char cVar86;
  int iVar87;
  int iVar88;
  bool bVar89;
  bool bVar90;
  int iVar91;
  long lVar92;
  bool bVar93;
  byte bVar94;
  int iVar95;
  long lVar96;
  bool bVar97;
  uint32_t *puVar98;
  byte bVar99;
  int iVar100;
  long lVar101;
  ulong uVar102;
  bool bVar103;
  char cVar104;
  int iVar105;
  int iVar106;
  FabArray<amrex::FArrayBox> *this_02;
  ulong uVar107;
  bool bVar108;
  int iVar109;
  int iVar110;
  uint32_t *puVar111;
  undefined1 auVar112 [16];
  _func_int *p_Var113;
  undefined *puVar114;
  double dVar115;
  double dVar116;
  double *pdVar117;
  byte bVar118;
  double dVar119;
  byte bVar120;
  double dVar121;
  double *pdVar122;
  Periodicity PVar123;
  IntVect edge_type;
  MFIter mfi;
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  long local_12e8;
  undefined1 local_11a8 [24];
  pointer pbStack_1190;
  undefined8 local_1188;
  int local_1180;
  ulong local_1160;
  int local_1154;
  int local_1150;
  int local_114c;
  FabArray<amrex::FArrayBox> *local_1148;
  EBCellFlag *local_1140;
  ulong local_1138;
  ulong local_1130;
  ulong local_1128;
  ulong local_1120;
  ulong local_1118;
  long local_1110;
  long local_1108;
  long local_1100;
  long local_10f8;
  long local_10f0;
  long local_10e8;
  double *local_10e0;
  long local_10d8;
  undefined **local_10d0;
  EBCellFlag *local_10c8;
  _func_int **local_10c0;
  Array4<amrex::EBCellFlag> local_10b8;
  double *local_1078;
  double *pdStack_1070;
  undefined1 local_1068 [112];
  FabArray<amrex::FArrayBox> *local_ff8;
  FabArray<amrex::EBCellFlagFab> *local_ff0;
  ulong local_fe8;
  ulong local_fe0;
  ulong local_fd8;
  EBCellFlag *local_fd0;
  ulong local_fc8;
  ulong local_fc0;
  ulong local_fb8;
  ulong local_fb0;
  double *local_fa8;
  double *local_fa0;
  long local_f98;
  EBCellFlag *local_f90;
  double *local_f88;
  double *local_f80;
  double *local_f78;
  uint local_f70;
  int local_f6c;
  int local_f68;
  int local_f64;
  int local_f60;
  int local_f5c;
  int local_f58;
  int local_f54;
  int local_f50;
  int local_f4c;
  int local_f48;
  int local_f44;
  int local_f40;
  int local_f3c;
  int local_f38;
  int local_f34;
  int local_f30;
  int local_f2c;
  int local_f28;
  int local_f24;
  int local_f20;
  int local_f1c;
  int local_f18;
  int local_f14;
  int local_f10;
  int local_f0c;
  int local_f08;
  int local_f04;
  uint local_f00;
  int local_efc;
  int local_ef8;
  int local_ef4;
  int local_ef0;
  int local_eec;
  int local_ee8;
  int local_ee4;
  int local_ee0;
  int local_edc;
  int local_ed8;
  int local_ed4;
  int local_ed0;
  int local_ecc;
  int local_ec8;
  int local_ec4;
  int local_ec0;
  int local_ebc;
  int local_eb8;
  int local_eb4;
  int local_eb0;
  int local_eac;
  int local_ea8;
  int local_ea4;
  int local_ea0;
  int local_e9c;
  int local_e98;
  int local_e94;
  int local_e90;
  int local_e8c;
  int local_e88;
  int local_e84;
  int local_e80;
  int local_e7c;
  int local_e78;
  int local_e74;
  int local_e70;
  int local_e6c;
  int local_e68;
  int local_e64;
  int local_e60;
  int local_e5c;
  int local_e58;
  int local_e54;
  int local_e50;
  int local_e4c;
  int local_e48;
  int local_e44;
  int local_e40;
  int local_e3c;
  int local_e38;
  int local_e34;
  int local_e30;
  int local_e2c;
  undefined1 local_e28 [24];
  IndexType IStack_e10;
  int local_e08;
  int local_e04;
  int local_e00;
  Array4<double> local_de0;
  FabArray<amrex::FArrayBox> *local_da0;
  FabArray<amrex::FArrayBox> *local_d98;
  FabArray<amrex::FArrayBox> *local_d90;
  FabArray<amrex::FArrayBox> *local_d88;
  FabArray<amrex::FArrayBox> *local_d80;
  long local_d78;
  long local_d70;
  long local_d68;
  long local_d60;
  double *local_d58;
  double *local_d50;
  ulong local_d48;
  ulong local_d40;
  ulong local_d38;
  double *local_d30;
  double *local_d28;
  double *local_d20;
  Array4<double> local_d18;
  Box local_cd4;
  Array4<double> local_cb8;
  FabArray<amrex::FArrayBox> *local_c70;
  FabArray<amrex::FArrayBox> *local_c68;
  FabArray<amrex::FArrayBox> *local_c60;
  FabArray<amrex::FArrayBox> *local_c58;
  FabArray<amrex::FArrayBox> *local_c50;
  FabArray<amrex::FArrayBox> *local_c48;
  FabArray<amrex::FArrayBox> *local_c40;
  FabArray<amrex::FArrayBox> *local_c38;
  FabArray<amrex::FArrayBox> *local_c30;
  FabArray<amrex::FArrayBox> *local_c28;
  FabArray<amrex::FArrayBox> *local_c20;
  FabArray<amrex::FArrayBox> *local_c18;
  FabArray<amrex::FArrayBox> *local_c10;
  FabArray<amrex::FArrayBox> *local_c08;
  FabArray<amrex::FArrayBox> *local_c00;
  FabArray<amrex::FArrayBox> *local_bf8;
  FabArray<amrex::FArrayBox> *local_bf0;
  FabArray<amrex::FArrayBox> *local_be8;
  FabArray<amrex::FArrayBox> *local_be0;
  FabArray<amrex::FArrayBox> *local_bd8;
  FabArray<amrex::FArrayBox> *local_bd0;
  FabArray<amrex::EBCellFlagFab> *local_bc8;
  long local_bc0;
  long local_bb8;
  long local_bb0;
  long local_ba8;
  double *local_ba0;
  long local_b98;
  long local_b90;
  long local_b88;
  long local_b80;
  long local_b78;
  long local_b70;
  long local_b68;
  long local_b60;
  long local_b58;
  long local_b50;
  long local_b48;
  long local_b40;
  long local_b38;
  long local_b30;
  long local_b28;
  EBCellFlag *local_b20;
  long local_b18;
  double *local_b10;
  long local_b08;
  double *local_b00;
  long local_af8;
  double *local_af0;
  long local_ae8;
  double *local_ae0;
  long local_ad8;
  double *local_ad0;
  long local_ac8;
  double *local_ac0;
  long local_ab8;
  double *local_ab0;
  long local_aa8;
  double *local_aa0;
  long local_a98;
  double *local_a90;
  long local_a88;
  double *local_a80;
  long local_a78;
  long local_a70;
  long local_a68;
  undefined **local_a60;
  long local_a58;
  EBCellFlag *local_a50;
  pointer local_a48;
  _func_int **local_a40;
  double *local_a38;
  double *local_a30;
  long local_a28;
  EBCellFlag *local_a20;
  long local_a18;
  long local_a10;
  double *local_a08;
  long local_a00;
  long local_9f8;
  long local_9f0;
  double *local_9e8;
  long local_9e0;
  double *local_9d8;
  long local_9d0;
  long local_9c8;
  double *local_9c0;
  long local_9b8;
  double *local_9b0;
  long local_9a8;
  double *local_9a0;
  long local_998;
  double *local_990;
  long local_988;
  double *local_980;
  long local_978;
  double *local_970;
  long local_968;
  double *local_960;
  long local_958;
  double *local_950;
  long local_948;
  double *local_940;
  long local_938;
  double *local_930;
  long local_928;
  long local_920;
  long local_918;
  long local_910;
  long local_908;
  long local_900;
  double *local_8f8;
  double *local_8f0;
  long local_8e8;
  long local_8e0;
  long local_8d8;
  long local_8d0;
  long local_8c8;
  long local_8c0;
  Arena *local_8b8;
  double *local_8b0;
  double *local_8a8;
  double *local_8a0;
  double *local_898;
  double *local_890;
  long local_888;
  double *local_880;
  double *local_878;
  double *local_870;
  double *local_868;
  long local_860;
  double *local_858;
  double *local_850;
  long local_848;
  undefined **local_840;
  EBCellFlag *local_838;
  _func_int **local_830;
  EBCellFlag *local_828;
  long local_820;
  ulong local_818;
  long local_810;
  long local_808;
  long local_800;
  long local_7f8;
  long local_7f0;
  long local_7e8;
  long local_7e0;
  double *local_7d8;
  double *local_7d0;
  double *local_7c8;
  double *local_7c0;
  double *local_7b8;
  long local_7b0;
  long local_7a8;
  long local_7a0;
  long local_798;
  long local_790;
  long local_788;
  long local_780;
  long local_778;
  long local_770;
  long local_768;
  long local_760;
  long local_758;
  long local_750;
  long local_748;
  long local_740;
  long local_738;
  long local_730;
  long local_728;
  double *local_720;
  double *local_718;
  double *local_710;
  double *local_708;
  double *local_700;
  double *local_6f8;
  double *local_6f0;
  double *local_6e8;
  double *local_6e0;
  double *local_6d8;
  double *local_6d0;
  double *local_6c8;
  double *local_6c0;
  double *local_6b8;
  long local_6b0;
  long local_6a8;
  long local_6a0;
  ulong local_698;
  ulong local_690;
  ulong local_688;
  double *local_680;
  double *local_678;
  double *local_670;
  double *local_668;
  double *local_660;
  double *local_658;
  Box local_64c;
  Array4<double> local_630;
  Array4<double> local_5f0;
  Array4<double> local_5b0;
  undefined1 local_570 [32];
  int local_550;
  int local_54c;
  int local_548;
  Array4<const_double> local_530;
  Array4<const_double> local_4f0;
  Array4<const_double> local_4b0;
  Array4<const_double> local_470;
  Array4<const_double> local_430;
  Array4<const_double> local_3f0;
  Array4<double> local_3b0;
  Array4<const_amrex::EBCellFlag> local_370;
  Array4<const_double> local_330;
  Array4<const_double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<const_double> local_270;
  Array4<const_double> local_230;
  Array4<const_double> local_1f0;
  Array4<const_double> local_1b0;
  Array4<const_double> local_170;
  Array4<amrex::EBCellFlag> local_130;
  Array4<double> local_f0;
  Array4<double> local_b0;
  Array4<double> local_70;
  ulong uVar70;
  
  local_1078 = (double *)
               CONCAT44(local_1078._4_4_,(int)CONCAT71(in_register_00000011,fill_boundary));
  ba = &fineLevel->m_covered_grids;
  amrex::coarsen((BoxArray *)local_1068,&fineLevel->m_grids,2);
  this_01 = &this->m_grids;
  BoxArray::operator=(this_01,(BoxArray *)local_1068);
  BoxArray::~BoxArray((BoxArray *)local_1068);
  amrex::coarsen((BoxArray *)local_1068,ba,2);
  BoxArray::operator=(&this->m_covered_grids,(BoxArray *)local_1068);
  BoxArray::~BoxArray((BoxArray *)local_1068);
  (this->m_dmap).m_ref.
  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fineLevel->m_dmap).m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_dmap).m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(fineLevel->m_dmap).m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar25 = BoxArray::coarsenable(&fineLevel->m_grids,2,2);
  uVar65 = indexType;
  if ((bVar25) &&
     ((peVar15 = (fineLevel->m_covered_grids).m_ref.
                 super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      (peVar15->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (peVar15->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish || (bVar25 = BoxArray::coarsenable(ba,2,2), bVar25)))) {
    dm = &this->m_dmap;
    this_00 = &this->m_levelset;
    local_10b8.p = (EBCellFlag *)0x100000001;
    local_10b8.jstride._0_4_ = 1;
    convert((BoxArray *)local_1068,this_01,(IntVect *)&local_10b8);
    local_11a8._0_8_ = (_func_int **)0x1;
    local_11a8._8_8_ = (Arena *)0x0;
    local_11a8._16_8_ = (pointer)0x0;
    pbStack_1190 = (pointer)0x0;
    local_1188 = (pointer)0x0;
    local_de0.p = (double *)&PTR__FabFactory_008378d0;
    MultiFab::define(this_00,(BoxArray *)local_1068,dm,1,0,(MFInfo *)local_11a8,
                     (FabFactory<amrex::FArrayBox> *)&local_de0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_11a8 + 0x10));
    BoxArray::~BoxArray((BoxArray *)local_1068);
    MFIter::MFIter((MFIter *)local_1068,(FabArrayBase *)this_00,true);
    bVar21 = 0;
    if ((int)local_1068._32_4_ < (int)local_1068._40_4_) {
      do {
        local_11a8._0_8_ = (_func_int **)0x0;
        local_11a8._8_8_ = local_11a8._8_8_ & 0xffffffff00000000;
        MFIter::tilebox((Box *)&local_de0,(MFIter *)local_1068,(IntVect *)local_11a8);
        MFIter::tilebox((Box *)&local_d18,(MFIter *)local_1068);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_11a8,&this_00->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1068);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_10b8,
                   &(fineLevel->m_levelset).super_FabArray<amrex::FArrayBox>,(MFIter *)local_1068);
        iVar18 = local_de0.kstride._4_4_;
        iVar109 = (int)local_de0.kstride;
        iVar105 = local_de0.jstride._4_4_;
        iVar87 = local_10b8.begin.z;
        iVar78 = local_10b8.begin.y;
        LVar24 = local_10b8.kstride;
        pEVar23 = local_10b8.p;
        lVar66 = CONCAT44(local_10b8.jstride._4_4_,(undefined4)local_10b8.jstride);
        if ((int)local_d18.jstride <= local_d18.kstride._4_4_) {
          lVar32 = (long)local_d18.p._4_4_;
          iVar75 = (int)local_d18.jstride * 2;
          iVar88 = (int)local_d18.jstride;
          do {
            if (local_d18.p._4_4_ <= (int)local_d18.kstride) {
              lVar101 = local_11a8._0_8_ +
                        ((long)iVar88 - (long)local_1180) * local_11a8._16_8_ * 8 +
                        (lVar32 - local_1188._4_4_) * local_11a8._8_8_ * 8 +
                        (long)(int)local_d18.p * 8 + (long)(int)local_1188 * -8;
              puVar98 = (uint32_t *)
                        ((long)&local_10b8.p
                                [(long)local_10b8.begin.x * -2 +
                                 (lVar32 * 2 - (long)local_10b8.begin.y) * lVar66 * 2 +
                                 (long)(int)local_d18.p * 4].flag +
                        ((long)iVar75 - (long)local_10b8.begin.z) * local_10b8.kstride * 8);
              lVar96 = lVar32;
              do {
                if ((int)local_d18.p <= local_d18.jstride._4_4_) {
                  lVar55 = 0;
                  puVar111 = puVar98;
                  do {
                    *(undefined8 *)(lVar101 + lVar55 * 8) = *(undefined8 *)puVar111;
                    lVar55 = lVar55 + 1;
                    puVar111 = puVar111 + 4;
                  } while ((local_d18.jstride._4_4_ - (int)local_d18.p) + 1 != (int)lVar55);
                }
                lVar96 = lVar96 + 1;
                lVar101 = lVar101 + local_11a8._8_8_ * 8;
                puVar98 = puVar98 + lVar66 * 4;
              } while ((int)local_d18.kstride + 1 != (int)lVar96);
            }
            iVar75 = iVar75 + 2;
            bVar25 = iVar88 != local_d18.kstride._4_4_;
            iVar88 = iVar88 + 1;
          } while (bVar25);
        }
        local_1160 = (ulong)(uint)local_de0.jstride;
        bVar68 = 0;
        if ((int)(uint)local_de0.jstride <= local_de0.kstride._4_4_) {
          iVar75 = (int)local_de0.p;
          iVar88 = local_de0.p._4_4_;
          iVar38 = local_de0.jstride._4_4_ - (int)local_de0.p;
          iVar91 = (int)local_de0.p * 2 - local_10b8.begin.x;
          bVar68 = 0;
          do {
            if (iVar88 <= iVar109) {
              iVar29 = (int)local_1160 * 2 - iVar87;
              lVar101 = LVar24 * iVar29;
              lVar96 = (iVar29 + 2) * LVar24;
              lVar32 = (iVar29 + 1) * LVar24;
              iVar29 = iVar88;
              do {
                if (iVar75 <= iVar105) {
                  iVar30 = iVar29 * 2 - iVar78;
                  lVar62 = lVar66 * iVar30;
                  lVar56 = (iVar30 + 2) * lVar66;
                  lVar55 = (iVar30 + 1) * lVar66;
                  iVar31 = iVar38 + 1;
                  iVar30 = iVar91;
                  bVar22 = bVar68;
                  do {
                    lVar76 = (long)iVar30;
                    dVar115 = *(double *)(pEVar23 + lVar62 * 2 + lVar76 * 2 + lVar101 * 2);
                    lVar83 = (long)(iVar30 + 1);
                    dVar116 = *(double *)(pEVar23 + lVar62 * 2 + lVar83 * 2 + lVar101 * 2);
                    if (((dVar115 < 0.0) || (bVar25 = true, 0.0 <= dVar116)) &&
                       (bVar25 = false, 0.0 <= dVar116)) {
                      bVar25 = dVar115 < 0.0;
                    }
                    iVar30 = iVar30 + 2;
                    lVar92 = (long)iVar30;
                    dVar14 = *(double *)(pEVar23 + lVar62 * 2 + lVar92 * 2 + lVar101 * 2);
                    if (((dVar116 < 0.0) || (bVar16 = true, 0.0 <= dVar14)) &&
                       (bVar16 = false, 0.0 <= dVar14)) {
                      bVar16 = dVar116 < 0.0;
                    }
                    dVar116 = *(double *)(pEVar23 + lVar56 * 2 + lVar76 * 2 + lVar101 * 2);
                    dVar9 = *(double *)(pEVar23 + lVar56 * 2 + lVar83 * 2 + lVar101 * 2);
                    if (((dVar116 < 0.0) || (bVar26 = true, 0.0 <= dVar9)) &&
                       (bVar26 = false, 0.0 <= dVar9)) {
                      bVar26 = dVar116 < 0.0;
                    }
                    dVar10 = *(double *)(pEVar23 + lVar56 * 2 + lVar92 * 2 + lVar101 * 2);
                    if (((dVar9 < 0.0) || (bVar57 = true, 0.0 <= dVar10)) &&
                       (bVar57 = false, 0.0 <= dVar10)) {
                      bVar57 = dVar9 < 0.0;
                    }
                    dVar9 = *(double *)(pEVar23 + lVar62 * 2 + lVar76 * 2 + lVar96 * 2);
                    dVar11 = *(double *)(pEVar23 + lVar62 * 2 + lVar83 * 2 + lVar96 * 2);
                    if (((dVar9 < 0.0) || (bVar34 = true, 0.0 <= dVar11)) &&
                       (bVar34 = false, 0.0 <= dVar11)) {
                      bVar34 = dVar9 < 0.0;
                    }
                    dVar12 = *(double *)(pEVar23 + lVar62 * 2 + lVar92 * 2 + lVar96 * 2);
                    if (((dVar11 < 0.0) || (bVar35 = true, 0.0 <= dVar12)) &&
                       (bVar35 = false, 0.0 <= dVar12)) {
                      bVar35 = dVar11 < 0.0;
                    }
                    dVar11 = *(double *)(pEVar23 + lVar56 * 2 + lVar76 * 2 + lVar96 * 2);
                    dVar13 = *(double *)(pEVar23 + lVar56 * 2 + lVar83 * 2 + lVar96 * 2);
                    if (((dVar11 < 0.0) || (bVar74 = true, 0.0 <= dVar13)) &&
                       (bVar74 = false, 0.0 <= dVar13)) {
                      bVar74 = dVar11 < 0.0;
                    }
                    dVar119 = *(double *)(pEVar23 + lVar56 * 2 + lVar92 * 2 + lVar96 * 2);
                    if (((dVar13 < 0.0) || (bVar77 = true, 0.0 <= dVar119)) &&
                       (bVar77 = false, 0.0 <= dVar119)) {
                      bVar77 = dVar13 < 0.0;
                    }
                    dVar13 = *(double *)(pEVar23 + lVar55 * 2 + lVar76 * 2 + lVar101 * 2);
                    if (((dVar115 < 0.0) || (bVar63 = true, 0.0 <= dVar13)) &&
                       (bVar63 = false, 0.0 <= dVar13)) {
                      bVar63 = dVar115 < 0.0;
                    }
                    bVar99 = -(dVar116 < 0.0 && 0.0 <= dVar13);
                    bVar68 = dVar13 < 0.0 | bVar99;
                    if (dVar116 < 0.0) {
                      bVar68 = bVar99;
                    }
                    dVar13 = *(double *)(pEVar23 + lVar55 * 2 + lVar92 * 2 + lVar101 * 2);
                    if (((dVar14 < 0.0) || (bVar89 = true, 0.0 <= dVar13)) &&
                       (bVar89 = false, 0.0 <= dVar13)) {
                      bVar89 = dVar14 < 0.0;
                    }
                    if (((dVar13 < 0.0) || (bVar93 = true, 0.0 <= dVar10)) &&
                       (bVar93 = false, 0.0 <= dVar10)) {
                      bVar93 = dVar13 < 0.0;
                    }
                    dVar13 = *(double *)(pEVar23 + lVar55 * 2 + lVar76 * 2 + lVar96 * 2);
                    if (((dVar9 < 0.0) || (bVar103 = true, 0.0 <= dVar13)) &&
                       (bVar103 = false, 0.0 <= dVar13)) {
                      bVar103 = dVar9 < 0.0;
                    }
                    bVar37 = -(0.0 <= dVar13 && dVar11 < 0.0);
                    bVar99 = dVar13 < 0.0 | bVar37;
                    if (dVar11 < 0.0) {
                      bVar99 = bVar37;
                    }
                    dVar13 = *(double *)(pEVar23 + lVar55 * 2 + lVar92 * 2 + lVar96 * 2);
                    if (((dVar12 < 0.0) || (bVar36 = true, 0.0 <= dVar13)) &&
                       (bVar36 = false, 0.0 <= dVar13)) {
                      bVar36 = dVar12 < 0.0;
                    }
                    if (((dVar13 < 0.0) || (bVar90 = true, 0.0 <= dVar119)) &&
                       (bVar90 = false, 0.0 <= dVar119)) {
                      bVar90 = dVar13 < 0.0;
                    }
                    dVar13 = *(double *)(pEVar23 + lVar62 * 2 + lVar76 * 2 + lVar32 * 2);
                    if (((dVar115 < 0.0) || (bVar84 = true, 0.0 <= dVar13)) &&
                       (bVar84 = false, 0.0 <= dVar13)) {
                      bVar84 = dVar115 < 0.0;
                    }
                    bVar120 = -(dVar9 < 0.0 && 0.0 <= dVar13);
                    bVar37 = dVar13 < 0.0 | bVar120;
                    if (dVar9 < 0.0) {
                      bVar37 = bVar120;
                    }
                    dVar13 = *(double *)(pEVar23 + lVar62 * 2 + lVar92 * 2 + lVar32 * 2);
                    if (((dVar14 < 0.0) || (bVar97 = true, 0.0 <= dVar13)) &&
                       (bVar97 = false, 0.0 <= dVar13)) {
                      bVar97 = dVar14 < 0.0;
                    }
                    bVar94 = -(0.0 <= dVar13 && dVar12 < 0.0);
                    bVar120 = dVar13 < 0.0 | bVar94;
                    if (dVar12 < 0.0) {
                      bVar120 = bVar94;
                    }
                    dVar13 = *(double *)(pEVar23 + lVar56 * 2 + lVar76 * 2 + lVar32 * 2);
                    if (((dVar116 < 0.0) || (bVar71 = true, 0.0 <= dVar13)) &&
                       (bVar71 = false, 0.0 <= dVar13)) {
                      bVar71 = dVar116 < 0.0;
                    }
                    bVar118 = -(dVar11 < 0.0 && 0.0 <= dVar13);
                    bVar94 = dVar13 < 0.0 | bVar118;
                    if (dVar11 < 0.0) {
                      bVar94 = bVar118;
                    }
                    dVar13 = *(double *)(pEVar23 + lVar56 * 2 + lVar92 * 2 + lVar32 * 2);
                    if (((dVar10 < 0.0) || (bVar108 = true, 0.0 <= dVar13)) &&
                       (bVar108 = false, 0.0 <= dVar13)) {
                      bVar108 = dVar10 < 0.0;
                    }
                    if (((dVar13 < 0.0) || (bVar27 = true, 0.0 <= dVar119)) &&
                       (bVar27 = false, 0.0 <= dVar119)) {
                      bVar27 = dVar13 < 0.0;
                    }
                    cVar64 = bVar63 + (bVar68 & 1);
                    cVar104 = bVar103 + (bVar99 & 1);
                    cVar85 = bVar84 + (bVar37 & 1);
                    cVar72 = bVar71 + (bVar94 & 1);
                    cVar58 = cVar104 + cVar64 + cVar85 + cVar72;
                    if (cVar58 == '\0') {
                      bVar99 = 0;
                      bVar68 = 0;
                    }
                    else if (cVar58 == '\x02') {
                      bVar99 = 1;
                      bVar68 = 0;
                    }
                    else {
                      bVar68 = 1;
                      bVar99 = 0;
                    }
                    cVar86 = bVar97 + (bVar120 & 1);
                    cVar58 = bVar90 + bVar36 + bVar93 + bVar89 + cVar86 + bVar27 + bVar108;
                    if (cVar58 == '\0') {
LAB_00632563:
                      bVar37 = 0;
                    }
                    else {
                      if (cVar58 != '\x02') {
                        bVar68 = 1;
                        goto LAB_00632563;
                      }
                      bVar37 = 1;
                    }
                    cVar86 = cVar85 + bVar35 + bVar34 + bVar16 + bVar25 + cVar86;
                    if (cVar86 == '\0') {
                      bVar120 = 0;
                    }
                    else if (cVar86 == '\x02') {
                      bVar120 = 1;
                    }
                    else {
                      bVar68 = 1;
                      bVar120 = 0;
                    }
                    cVar58 = cVar72 + bVar77 + bVar74 + bVar57 + bVar26 + bVar27 + bVar108;
                    if (cVar58 == '\0') {
LAB_006325d6:
                      bVar94 = 0;
                    }
                    else {
                      if (cVar58 != '\x02') {
                        bVar68 = 1;
                        goto LAB_006325d6;
                      }
                      bVar94 = 1;
                    }
                    cVar58 = bVar57 + bVar26 + bVar16 + bVar25 + cVar64 + bVar93 + bVar89;
                    if (cVar58 == '\0') {
                      bVar118 = 0;
                    }
                    else if (cVar58 == '\x02') {
                      bVar118 = 1;
                    }
                    else {
                      bVar68 = 1;
                      bVar118 = 0;
                    }
                    cVar58 = bVar77 + bVar74 + bVar35 + bVar34 + cVar104 + bVar90 + bVar36;
                    if (cVar58 == '\0') {
                      bVar19 = 0;
                    }
                    else if (cVar58 == '\x02') {
                      bVar19 = 1;
                    }
                    else {
                      bVar68 = 1;
                      bVar19 = 0;
                    }
                    if ((bool)(bVar37 & bVar118 & bVar99 & bVar120 & bVar94 & bVar19)) {
                      bVar99 = (dVar119 < 0.0) + (dVar11 < 0.0) + (dVar12 < 0.0) +
                               (dVar9 < 0.0) + (dVar10 < 0.0) +
                               (dVar116 < 0.0) + (dVar115 < 0.0) + (dVar14 < 0.0);
                      if ((bVar99 & 0xfb) == 2) {
                        bVar68 = 1;
                      }
                      else if (bVar99 != 4) {
                        Abort_host("amrex::check_mvmc: how did this happen? nopen != 4");
                        bVar68 = 1;
                      }
                    }
                    if (bVar68 < bVar22) {
                      bVar68 = bVar22;
                    }
                    iVar31 = iVar31 + -1;
                    bVar22 = bVar68;
                  } while (iVar31 != 0);
                }
                bVar25 = iVar29 != iVar109;
                iVar29 = iVar29 + 1;
              } while (bVar25);
            }
            iVar29 = (int)local_1160;
            local_1160 = (ulong)(iVar29 + 1);
          } while (iVar29 != iVar18);
        }
        if (bVar21 <= bVar68) {
          bVar21 = bVar68;
        }
        MFIter::operator++((MFIter *)local_1068);
      } while ((int)local_1068._32_4_ < (int)local_1068._40_4_);
    }
    MFIter::~MFIter((MFIter *)local_1068);
    local_1068[0] = bVar21;
    ParallelDescriptor::ReduceBoolOr((bool *)local_1068);
    uVar65 = local_1068[0];
    if ((bool)local_1068[0] == false) {
      local_bc8 = &this->m_cellflag;
      local_1068._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_1068._8_8_ = 0;
      local_1068._16_8_ = 0;
      local_1068._24_8_ = 0;
      local_1068._32_8_ = 0;
      local_10b8.p = (EBCellFlag *)&PTR__FabFactory_00838040;
      local_11a8._0_8_ = (_func_int **)0x200000002;
      local_11a8._8_4_ = 2;
      (*(this->m_cellflag).super_FabArrayBase._vptr_FabArrayBase[3])
                (local_bc8,this_01,dm,1,(FabFactory<amrex::FArrayBox> *)local_11a8,local_1068,
                 &local_10b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1068 + 0x10));
      local_d80 = &(this->m_volfrac).super_FabArray<amrex::FArrayBox>;
      local_1068._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_1068._8_8_ = 0;
      local_1068._16_8_ = 0;
      local_1068._24_8_ = 0;
      local_1068._32_8_ = 0;
      local_11a8._0_8_ = &PTR__FabFactory_008378d0;
      MultiFab::define((MultiFab *)local_d80,this_01,dm,1,2,(MFInfo *)local_1068,
                       (FabFactory<amrex::FArrayBox> *)local_11a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1068 + 0x10));
      local_bd0 = &(this->m_centroid).super_FabArray<amrex::FArrayBox>;
      local_1068._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_1068._8_8_ = 0;
      local_1068._16_8_ = 0;
      local_1068._24_8_ = 0;
      local_1068._32_8_ = 0;
      local_11a8._0_8_ = &PTR__FabFactory_008378d0;
      MultiFab::define((MultiFab *)local_bd0,this_01,dm,3,2,(MFInfo *)local_1068,
                       (FabFactory<amrex::FArrayBox> *)local_11a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1068 + 0x10));
      local_bd8 = &(this->m_bndryarea).super_FabArray<amrex::FArrayBox>;
      local_1068._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_1068._8_8_ = 0;
      local_1068._16_8_ = 0;
      local_1068._24_8_ = 0;
      local_1068._32_8_ = 0;
      local_11a8._0_8_ = &PTR__FabFactory_008378d0;
      MultiFab::define((MultiFab *)local_bd8,this_01,dm,1,2,(MFInfo *)local_1068,
                       (FabFactory<amrex::FArrayBox> *)local_11a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1068 + 0x10));
      local_be0 = &(this->m_bndrycent).super_FabArray<amrex::FArrayBox>;
      local_1068._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_1068._8_8_ = 0;
      local_1068._16_8_ = 0;
      local_1068._24_8_ = 0;
      local_1068._32_8_ = 0;
      local_11a8._0_8_ = &PTR__FabFactory_008378d0;
      MultiFab::define((MultiFab *)local_be0,this_01,dm,3,2,(MFInfo *)local_1068,
                       (FabFactory<amrex::FArrayBox> *)local_11a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1068 + 0x10));
      local_be8 = &(this->m_bndrynorm).super_FabArray<amrex::FArrayBox>;
      local_1068._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_1068._8_8_ = (FabArrayBase *)0x0;
      local_1068._16_8_ = 0;
      local_1068._24_8_ = 0;
      local_1068._32_8_ = 0;
      local_11a8._0_8_ = &PTR__FabFactory_008378d0;
      MultiFab::define((MultiFab *)local_be8,this_01,dm,3,2,(MFInfo *)local_1068,
                       (FabFactory<amrex::FArrayBox> *)local_11a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1068 + 0x10));
      lVar96 = 0xd48;
      local_12e8 = 0x11c8;
      lVar66 = 0x1648;
      lVar32 = 0;
      do {
        iVar78 = (int)lVar32;
        if (iVar78 == 1) {
          local_10b8.jstride._0_4_ = 0;
          local_10b8.p = (EBCellFlag *)0x100000000;
        }
        else if (iVar78 == 0) {
          local_10b8.p = (EBCellFlag *)0x1;
          local_10b8.jstride._0_4_ = 0;
        }
        else {
          local_10b8.jstride._0_4_ = 1;
          local_10b8.p = (EBCellFlag *)0x0;
        }
        plVar1 = (long *)((long)(this->m_geom).super_CoordSys.offset + lVar96 + -8);
        convert((BoxArray *)local_1068,this_01,(IntVect *)&local_10b8);
        local_11a8._0_8_ = (_func_int **)0x1;
        pbStack_1190 = (pointer)0x0;
        local_1188 = (pointer)0x0;
        local_11a8._8_8_ = (Arena *)0x0;
        local_11a8._16_8_ = (pointer)0x0;
        local_de0.p = (double *)&PTR__FabFactory_008378d0;
        (**(code **)(*plVar1 + 0x10))(plVar1,(BoxArray *)local_1068,dm,1,2,local_11a8,&local_de0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_11a8 + 0x10));
        BoxArray::~BoxArray((BoxArray *)local_1068);
        if (iVar78 == 1) {
          local_10b8.jstride._0_4_ = 0;
          local_10b8.p = (EBCellFlag *)0x100000000;
        }
        else if (iVar78 == 0) {
          local_10b8.p = (EBCellFlag *)0x1;
          local_10b8.jstride._0_4_ = 0;
        }
        else {
          local_10b8.jstride._0_4_ = 1;
          local_10b8.p = (EBCellFlag *)0x0;
        }
        convert((BoxArray *)local_1068,this_01,(IntVect *)&local_10b8);
        local_11a8._0_8_ = (_func_int **)0x1;
        pbStack_1190 = (pointer)0x0;
        local_1188 = (pointer)0x0;
        local_11a8._8_8_ = (Arena *)0x0;
        local_11a8._16_8_ = (pointer)0x0;
        local_de0.p = (double *)&PTR__FabFactory_008378d0;
        (**(code **)(*(long *)((long)&(this->m_cellflag).super_FabArrayBase.boxarray.m_bat.m_op +
                              lVar96 + 0x2c) + 0x10))
                  ((long)(this->m_geom).super_CoordSys.offset + local_12e8 + -8,
                   (BoxArray *)local_1068,dm,2,2,local_11a8,&local_de0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_11a8 + 0x10));
        BoxArray::~BoxArray((BoxArray *)local_1068);
        local_10b8.p = (EBCellFlag *)0x100000001;
        local_10b8.jstride._0_4_ = 1;
        *(undefined4 *)((long)&local_10b8.p + lVar32 * 4) = 0;
        convert((BoxArray *)local_1068,this_01,(IntVect *)&local_10b8);
        local_11a8._0_8_ = (_func_int **)0x1;
        pbStack_1190 = (pointer)0x0;
        local_1188 = (pointer)0x0;
        local_11a8._8_8_ = (Arena *)0x0;
        local_11a8._16_8_ = (pointer)0x0;
        local_de0.p = (double *)&PTR__FabFactory_008378d0;
        (**(code **)(*(long *)((long)&(this->m_bndryarea).super_FabArray<amrex::FArrayBox>.
                                      super_FabArrayBase.boxarray.m_bat.m_op + lVar96 + 0x2c) + 0x10
                    ))((long)(this->m_geom).super_CoordSys.offset + lVar66 + -8,local_1068,dm,1,2,
                       local_11a8,&local_de0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_11a8 + 0x10));
        BoxArray::~BoxArray((BoxArray *)local_1068);
        lVar32 = lVar32 + 1;
        lVar96 = lVar96 + 0x180;
        local_12e8 = local_12e8 + 0x180;
        lVar66 = lVar66 + 0x180;
      } while (lVar32 != 3);
      local_ff0 = &fineLevel->m_cellflag;
      local_1148 = &(fineLevel->m_volfrac).super_FabArray<amrex::FArrayBox>;
      local_d88 = &(fineLevel->m_centroid).super_FabArray<amrex::FArrayBox>;
      local_d90 = &(fineLevel->m_bndryarea).super_FabArray<amrex::FArrayBox>;
      local_d98 = &(fineLevel->m_bndrycent).super_FabArray<amrex::FArrayBox>;
      local_da0 = &(fineLevel->m_bndrynorm).super_FabArray<amrex::FArrayBox>;
      local_ff8 = (FabArray<amrex::FArrayBox> *)&fineLevel->m_areafrac;
      if ((char)local_1078 != '\0') {
        PVar123 = Geometry::periodicity(&fineLevel->m_geom);
        local_5b0.p = PVar123.period.vect._0_8_;
        local_5b0.jstride._0_4_ = PVar123.period.vect[2];
        FabArray<amrex::EBCellFlagFab>::FillBoundary<amrex::EBCellFlag>
                  (local_ff0,(Periodicity *)&local_5b0,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>(local_1148,(Periodicity *)&local_5b0,false)
        ;
        FabArray<amrex::FArrayBox>::FillBoundary<double>(local_d88,(Periodicity *)&local_5b0,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>(local_d90,(Periodicity *)&local_5b0,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>(local_d98,(Periodicity *)&local_5b0,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>(local_da0,(Periodicity *)&local_5b0,false);
        lVar66 = 3;
        this_02 = local_ff8;
        do {
          FabArray<amrex::FArrayBox>::FillBoundary<double>(this_02,(Periodicity *)&local_5b0,false);
          FabArray<amrex::FArrayBox>::FillBoundary<double>
                    (this_02 + 3,(Periodicity *)&local_5b0,false);
          FabArray<amrex::FArrayBox>::FillBoundary<double>
                    (this_02 + 6,(Periodicity *)&local_5b0,false);
          this_02 = this_02 + 1;
          lVar66 = lVar66 + -1;
        } while (lVar66 != 0);
        peVar15 = (fineLevel->m_covered_grids).m_ref.
                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar15->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (peVar15->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          Periodicity::shiftIntVect
                    ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_5f0,
                     (Periodicity *)&local_5b0);
          local_cb8.p = (double *)0x0;
          local_cb8.jstride = 0;
          local_cb8.kstride = 0;
          MFIter::MFIter((MFIter *)local_1068,&local_1148->super_FabArrayBase,'\0');
          if ((int)local_1068._32_4_ < (int)local_1068._40_4_) {
            do {
              FabArrayBase::fabbox
                        ((Box *)local_570,(FabArrayBase *)local_1068._8_8_,
                         *(int *)(*(long *)local_1068._56_8_ + (long)(int)local_1068._32_4_ * 4));
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)local_11a8,local_1148,(MFIter *)local_1068);
              FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                        (&local_10b8,local_ff0,(MFIter *)local_1068);
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        (&local_de0,local_ff8,(MFIter *)local_1068);
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        (&local_d18,
                         &(fineLevel->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                         (MFIter *)local_1068);
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        (&local_630,
                         &(fineLevel->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                         (MFIter *)local_1068);
              LVar24 = local_5f0.jstride;
              IVar20.itype = IStack_e10.itype;
              IStack_e10.itype = local_570._24_4_;
              for (pdVar67 = local_5f0.p; local_570._24_4_ = IStack_e10.itype,
                  pdVar67 != (double *)LVar24; pdVar67 = (double *)((long)pdVar67 + 0xc)) {
                local_e28._0_8_ =
                     CONCAT44((int)((ulong)local_570._0_8_ >> 0x20) + (int)((ulong)*pdVar67 >> 0x20)
                              ,(int)local_570._0_8_ + SUB84(*pdVar67,0));
                local_e28._8_4_ = local_570._8_4_ + *(int *)(pdVar67 + 1);
                local_e28._12_4_ = local_570._12_4_ + *(int *)pdVar67;
                local_e28._16_4_ = local_570._16_4_ + *(int *)((long)pdVar67 + 4);
                local_e28._20_4_ = local_570._20_4_ + *(int *)(pdVar67 + 1);
                BoxArray::intersections
                          (ba,(Box *)local_e28,
                           (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            *)&local_cb8);
                IVar20.itype = IStack_e10.itype;
                for (pdVar33 = local_cb8.p; pdVar33 != (double *)local_cb8.jstride;
                    pdVar33 = pdVar33 + 4) {
                  uVar59 = *(uint *)((long)pdVar33 + 0x1c);
                  local_e28._0_4_ = *(int *)((long)pdVar33 + 4) - *(int *)pdVar67;
                  local_e28._4_4_ = *(int *)(pdVar33 + 1) - *(int *)((long)pdVar67 + 4);
                  local_e28._8_4_ = *(int *)((long)pdVar33 + 0xc) - *(int *)(pdVar67 + 1);
                  iVar78 = *(int *)(pdVar33 + 2) - *(int *)pdVar67;
                  iVar87 = *(int *)((long)pdVar33 + 0x14) - *(int *)((long)pdVar67 + 4);
                  iVar105 = *(int *)(pdVar33 + 3) - *(int *)(pdVar67 + 1);
                  local_e28._12_4_ = iVar78;
                  local_e28._16_4_ = iVar87;
                  local_e28._20_4_ = iVar105;
                  lVar66 = 0;
                  do {
                    if ((uVar59 >> ((uint)lVar66 & 0x1f) & 1) == 0) {
                      *(int *)(local_e28 + lVar66 * 4 + 0xc) =
                           *(int *)(local_e28 + lVar66 * 4 + 0xc) + 1;
                    }
                    lVar66 = lVar66 + 1;
                  } while (lVar66 != 3);
                  IStack_e10.itype = 7;
                  if ((int)local_e28._8_4_ <= (int)local_e28._20_4_) {
                    iVar109 = local_e28._8_4_;
                    do {
                      iVar18 = local_e28._4_4_;
                      if ((int)local_e28._4_4_ <= (int)local_e28._16_4_) {
                        do {
                          if ((int)local_e28._0_4_ <= (int)local_e28._12_4_) {
                            iVar75 = local_e28._0_4_;
                            do {
                              if (((((int)local_e28._0_4_ <= iVar75) &&
                                   ((int)local_e28._4_4_ <= iVar18)) &&
                                  (((int)local_e28._8_4_ <= iVar109 &&
                                   ((iVar75 <= iVar78 && (iVar18 <= iVar87)))))) &&
                                 (iVar109 <= iVar105)) {
                                *(_func_int **)
                                 (local_11a8._0_8_ +
                                 (((long)iVar18 - (long)local_1188._4_4_) * local_11a8._8_8_ +
                                 (long)(iVar75 - (int)local_1188) +
                                 ((long)iVar109 - (long)local_1180) * local_11a8._16_8_) * 8) =
                                     (_func_int *)0x0;
                                local_10b8.p
                                [((long)iVar18 - (long)local_10b8.begin.y) *
                                 CONCAT44(local_10b8.jstride._4_4_,(undefined4)local_10b8.jstride) +
                                 (long)(iVar75 - local_10b8.begin.x) +
                                 ((long)iVar109 - (long)local_10b8.begin.z) * local_10b8.kstride].
                                flag = 0x40003;
                              }
                              if ((((((int)local_e28._0_4_ <= iVar75) &&
                                    ((int)local_e28._4_4_ <= iVar18)) &&
                                   ((int)local_e28._8_4_ <= iVar109)) &&
                                  ((iVar75 <= (int)((~uVar59 & 1) + iVar78) && (iVar18 <= iVar87))))
                                 && (iVar109 <= iVar105)) {
                                local_de0.p
                                [((long)iVar18 - (long)local_de0.begin.y) *
                                 CONCAT44(local_de0.jstride._4_4_,(uint)local_de0.jstride) +
                                 (long)(iVar75 - local_de0.begin.x) +
                                 ((long)iVar109 - (long)local_de0.begin.z) *
                                 CONCAT44(local_de0.kstride._4_4_,(int)local_de0.kstride)] = 0.0;
                              }
                              if ((((int)local_e28._0_4_ <= iVar75) &&
                                  ((int)local_e28._4_4_ <= iVar18)) &&
                                 (((int)local_e28._8_4_ <= iVar109 &&
                                  (((iVar75 <= iVar78 &&
                                    (iVar18 <= (int)(iVar87 + (uint)((uVar59 & 2) == 0)))) &&
                                   (iVar109 <= iVar105)))))) {
                                *(undefined8 *)
                                 (CONCAT44(local_d18.p._4_4_,(int)local_d18.p) +
                                  ((long)iVar18 - (long)local_d18.begin.y) *
                                  CONCAT44(local_d18.jstride._4_4_,(int)local_d18.jstride) * 8 +
                                  (long)(iVar75 - local_d18.begin.x) * 8 +
                                 ((long)iVar109 - (long)local_d18.begin.z) *
                                 CONCAT44(local_d18.kstride._4_4_,(int)local_d18.kstride) * 8) = 0;
                              }
                              if (((((int)local_e28._0_4_ <= iVar75) &&
                                   ((int)local_e28._4_4_ <= iVar18)) &&
                                  (((int)local_e28._8_4_ <= iVar109 &&
                                   ((iVar75 <= iVar78 && (iVar18 <= iVar87)))))) &&
                                 (iVar109 <= (int)(iVar105 + (uint)((uVar59 & 4) == 0)))) {
                                local_630.p
                                [((long)iVar18 - (long)local_630.begin.y) * local_630.jstride +
                                 (long)(iVar75 - local_630.begin.x) +
                                 ((long)iVar109 - (long)local_630.begin.z) * local_630.kstride] =
                                     0.0;
                              }
                              iVar75 = iVar75 + 1;
                            } while (local_e28._12_4_ + 1 != iVar75);
                          }
                          bVar25 = iVar18 != local_e28._16_4_;
                          iVar18 = iVar18 + 1;
                        } while (bVar25);
                      }
                      bVar25 = iVar109 != local_e28._20_4_;
                      iVar109 = iVar109 + 1;
                    } while (bVar25);
                  }
                  IVar20.itype = IStack_e10.itype;
                }
                IStack_e10.itype = local_570._24_4_;
              }
              IStack_e10.itype = IVar20.itype;
              MFIter::operator++((MFIter *)local_1068);
            } while ((int)local_1068._32_4_ < (int)local_1068._40_4_);
          }
          MFIter::~MFIter((MFIter *)local_1068);
          if (local_cb8.p != (double *)0x0) {
            operator_delete(local_cb8.p,local_cb8.kstride - (long)local_cb8.p);
          }
          if (local_5f0.p != (double *)0x0) {
            operator_delete(local_5f0.p,local_5f0.kstride - (long)local_5f0.p);
          }
        }
      }
      MFIter::MFIter((MFIter *)local_1068,&local_d80->super_FabArrayBase,true);
      uVar59 = 0;
      if ((int)local_1068._32_4_ < (int)local_1068._40_4_) {
        local_bf0 = (FabArray<amrex::FArrayBox> *)&fineLevel->m_facecent;
        local_bf8 = (FabArray<amrex::FArrayBox> *)&fineLevel->m_edgecent;
        local_c08 = &(this->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_c18 = &(this->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        local_c28 = &(this->m_facecent)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_c38 = &(this->m_facecent)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        local_c48 = &(this->m_edgecent)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_c58 = &(this->m_edgecent)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        local_c00 = &(fineLevel->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_c10 = &(fineLevel->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        local_c20 = &(fineLevel->m_facecent)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_c30 = &(fineLevel->m_facecent)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        local_c40 = &(fineLevel->m_edgecent)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_c50 = &(fineLevel->m_edgecent)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        local_c60 = (FabArray<amrex::FArrayBox> *)&this->m_areafrac;
        local_c68 = (FabArray<amrex::FArrayBox> *)&this->m_facecent;
        local_c70 = (FabArray<amrex::FArrayBox> *)&this->m_edgecent;
        do {
          local_f70 = uVar59;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_11a8,local_d80,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&local_10b8,local_bd0,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_de0,local_bd8,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_d18,local_be0,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_630,local_be8,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_570,local_c60,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_e28,local_c08,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_5f0,local_c18,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_cb8,local_c68,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_5b0,local_c28,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_3b0,local_c38,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_70,local_c70,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_b0,local_c48,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_f0,local_c58,(MFIter *)local_1068);
          FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                    (&local_130,local_bc8,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_170,local_1148,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_3f0,local_d88,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1b0,local_d90,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_430,local_d98,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_470,local_da0,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1f0,local_ff8,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_230,local_c00,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_270,local_c10,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_4b0,local_bf0,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_4f0,local_c20,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_530,local_c30,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_2b0,local_bf8,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_2f0,local_c40,(MFIter *)local_1068);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_330,local_c50,(MFIter *)local_1068);
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (&local_370,local_ff0,(MFIter *)local_1068);
          BATransformer::operator()
                    (&local_cd4,(BATransformer *)(local_1068._8_8_ + 8),
                     (Box *)((long)*(int *)(*(long *)local_1068._56_8_ +
                                           (long)(int)local_1068._32_4_ * 4) * 0x1c +
                            *(long *)&(((((shared_ptr<amrex::BARef> *)(local_1068._8_8_ + 0x50))->
                                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data));
          MFIter::grownnodaltilebox(&local_64c,(MFIter *)local_1068,-1,2);
          iVar18 = local_cd4.bigend.vect[2];
          iVar109 = local_cd4.bigend.vect[1];
          iVar105 = local_cd4.bigend.vect[0];
          iVar87 = local_cd4.smallend.vect[2];
          iVar78 = local_cd4.smallend.vect[1];
          uVar28 = 0;
          local_f00 = local_64c.bigend.vect[2];
          if (local_64c.smallend.vect[2] <= local_64c.bigend.vect[2]) {
            iVar75 = local_cd4.bigend.vect[0] + 2;
            iVar88 = local_cd4.bigend.vect[1] + 2;
            iVar91 = local_cd4.bigend.vect[2] + 2;
            uVar59 = local_cd4.btype.itype & 1;
            local_e2c = ((local_cd4.btype.itype & 2) >> 1 ^ 1) + local_cd4.bigend.vect[1];
            local_e38 = ((local_cd4.btype.itype & 4) >> 2 ^ 1) + local_cd4.bigend.vect[2];
            local_e3c = local_cd4.bigend.vect[0] + 3;
            if (uVar59 != 0) {
              local_e3c = iVar75;
            }
            local_e40 = local_cd4.bigend.vect[1] + 3;
            if ((local_cd4.btype.itype & 2) != 0) {
              local_e40 = iVar88;
            }
            local_e50 = local_cd4.bigend.vect[2] + 3;
            if ((local_cd4.btype.itype & 4) != 0) {
              local_e50 = iVar91;
            }
            local_e30 = local_cd4.bigend.vect[0] - uVar59;
            local_e44 = iVar75 - uVar59;
            uVar60 = local_cd4.btype.itype >> 1 & 1;
            uVar28 = local_cd4.btype.itype >> 2 & 1;
            local_e34 = local_cd4.bigend.vect[1] - uVar60;
            local_e4c = iVar88 - uVar60;
            local_e48 = local_cd4.bigend.vect[2] - uVar28;
            local_e54 = iVar91 - uVar28;
            iVar73 = (uVar60 ^ 1) + local_cd4.bigend.vect[1] + 2;
            iVar61 = (uVar60 ^ 1) + local_cd4.bigend.vect[1];
            local_114c = (uVar28 ^ 1) + local_cd4.bigend.vect[2] + 2;
            iVar29 = (uVar28 ^ 1) + local_cd4.bigend.vect[2];
            iVar30 = (uVar59 ^ 1) + local_cd4.bigend.vect[0];
            iVar31 = (uVar59 ^ 1) + 2 + local_cd4.bigend.vect[0];
            local_10e8 = local_10b8.nstride;
            local_10f0 = local_10b8.nstride << 4;
            local_10f8 = local_d18.nstride;
            local_1100 = local_d18.nstride << 4;
            local_1108 = local_630.nstride;
            local_1110 = local_630.nstride << 4;
            local_688 = (ulong)(uint)-local_f0.begin.x;
            local_690 = (ulong)(uint)-local_b0.begin.x;
            local_698 = (ulong)(uint)-local_70.begin.x;
            local_1118 = (ulong)(uint)-local_630.begin.x;
            local_1120 = (ulong)(uint)-local_d18.begin.x;
            local_1128 = (ulong)(uint)-local_de0.begin.x;
            local_1130 = (ulong)(uint)-local_10b8.begin.x;
            local_1138 = (ulong)(uint)-(int)local_1188;
            local_fe0 = (ulong)(uint)-local_130.begin.x;
            local_fb0 = (ulong)(uint)-local_cb8.begin.x;
            local_d38 = (ulong)(uint)-local_550;
            local_fb8 = (ulong)(uint)-local_5b0.begin.x;
            local_d40 = (ulong)(uint)-local_e08;
            local_fc0 = (ulong)(uint)-local_3b0.begin.x;
            local_d48 = (ulong)(uint)-local_5f0.begin.x;
            local_e58 = -local_2b0.begin.x;
            local_e5c = -local_1f0.begin.x;
            local_e60 = -local_370.begin.x;
            local_e64 = -local_270.begin.x;
            local_e68 = -local_230.begin.x;
            local_e6c = -local_470.begin.x;
            local_e70 = -local_430.begin.x;
            local_e74 = -local_1b0.begin.x;
            local_e78 = -local_3f0.begin.x;
            local_e7c = -local_170.begin.x;
            local_e80 = -local_4b0.begin.x;
            local_e84 = -local_4f0.begin.x;
            local_e88 = -local_530.begin.x;
            local_e8c = -local_2f0.begin.x;
            local_e90 = -local_330.begin.x;
            local_fd8 = (ulong)(uint)local_cd4.smallend.vect[0];
            local_a40 = (_func_int **)local_11a8._0_8_;
            local_8b8 = (Arena *)local_11a8._8_8_;
            local_a48 = (pointer)local_11a8._16_8_;
            local_e94 = local_1188._4_4_;
            local_f04 = local_1180;
            local_a50 = local_10b8.p;
            local_8c0 = CONCAT44(local_10b8.jstride._4_4_,(undefined4)local_10b8.jstride);
            local_a58 = local_10b8.kstride;
            local_e98 = local_10b8.begin.y;
            local_f08 = local_10b8.begin.z;
            local_a60 = (undefined **)local_de0.p;
            local_8c8 = CONCAT44(local_de0.jstride._4_4_,(uint)local_de0.jstride);
            local_a68 = CONCAT44(local_de0.kstride._4_4_,(int)local_de0.kstride);
            local_e9c = local_de0.begin.y;
            local_f0c = local_de0.begin.z;
            local_a70 = CONCAT44(local_d18.p._4_4_,(int)local_d18.p);
            local_8d0 = CONCAT44(local_d18.jstride._4_4_,(int)local_d18.jstride);
            local_a78 = CONCAT44(local_d18.kstride._4_4_,(int)local_d18.kstride);
            local_ea0 = local_d18.begin.y;
            local_f10 = local_d18.begin.z;
            local_a80 = local_630.p;
            local_8d8 = local_630.jstride;
            local_a88 = local_630.kstride;
            local_ea4 = local_630.begin.y;
            local_f14 = local_630.begin.z;
            local_a90 = (double *)local_570._0_8_;
            local_8e0 = CONCAT44(local_570._12_4_,local_570._8_4_);
            local_a98 = CONCAT44(local_570._20_4_,local_570._16_4_);
            local_ea8 = local_54c;
            local_f18 = local_548;
            local_aa0 = (double *)local_e28._0_8_;
            local_8e8 = CONCAT44(local_e28._12_4_,local_e28._8_4_);
            local_aa8 = CONCAT44(local_e28._20_4_,local_e28._16_4_);
            local_eac = local_e04;
            local_f1c = local_e00;
            local_ab0 = local_5f0.p;
            local_8f0 = (double *)local_5f0.jstride;
            local_ab8 = local_5f0.kstride;
            local_eb0 = local_5f0.begin.y;
            local_f20 = local_5f0.begin.z;
            local_ac0 = local_cb8.p;
            local_8f8 = (double *)local_cb8.jstride;
            local_ac8 = local_cb8.kstride;
            local_6a0 = local_cb8.nstride;
            local_eb4 = local_cb8.begin.y;
            local_f24 = local_cb8.begin.z;
            local_ad0 = local_5b0.p;
            local_900 = CONCAT44(local_5b0.jstride._4_4_,(int)local_5b0.jstride);
            local_ad8 = local_5b0.kstride;
            local_6a8 = local_5b0.nstride;
            local_eb8 = local_5b0.begin.y;
            local_f28 = local_5b0.begin.z;
            local_ae0 = local_3b0.p;
            local_908 = local_3b0.jstride;
            local_ae8 = local_3b0.kstride;
            local_6b0 = local_3b0.nstride;
            local_ebc = local_3b0.begin.y;
            local_f2c = local_3b0.begin.z;
            local_af0 = local_70.p;
            local_910 = local_70.jstride;
            local_af8 = local_70.kstride;
            local_ec0 = local_70.begin.y;
            local_f30 = local_70.begin.z;
            local_b00 = local_b0.p;
            local_918 = local_b0.jstride;
            local_b08 = local_b0.kstride;
            local_ec4 = local_b0.begin.y;
            local_f34 = local_b0.begin.z;
            local_b10 = local_f0.p;
            local_920 = local_f0.jstride;
            local_b18 = local_f0.kstride;
            local_ec8 = local_f0.begin.y;
            local_f38 = local_f0.begin.z;
            local_b20 = local_130.p;
            local_928 = local_130.jstride;
            local_b28 = local_130.kstride;
            local_ecc = local_130.begin.y;
            local_f3c = local_130.begin.z;
            local_930 = local_170.p;
            local_938 = local_170.jstride;
            local_b30 = local_170.kstride;
            local_ed0 = local_170.begin.y;
            local_f40 = local_170.begin.z;
            local_940 = local_3f0.p;
            local_948 = local_3f0.jstride;
            local_b38 = local_3f0.kstride;
            local_ed4 = local_3f0.begin.y;
            local_f44 = local_3f0.begin.z;
            local_950 = local_1b0.p;
            local_958 = local_1b0.jstride;
            local_b40 = local_1b0.kstride;
            local_ed8 = local_1b0.begin.y;
            local_f48 = local_1b0.begin.z;
            local_960 = local_430.p;
            local_968 = local_430.jstride;
            local_b48 = local_430.kstride;
            local_edc = local_430.begin.y;
            local_f4c = local_430.begin.z;
            local_970 = local_470.p;
            local_978 = local_470.jstride;
            local_b50 = local_470.kstride;
            local_ee0 = local_470.begin.y;
            local_f50 = local_470.begin.z;
            local_980 = local_1f0.p;
            local_988 = local_1f0.jstride;
            local_b58 = local_1f0.kstride;
            local_ee4 = local_1f0.begin.y;
            local_f54 = local_1f0.begin.z;
            local_990 = local_230.p;
            local_998 = local_230.jstride;
            local_b60 = local_230.kstride;
            local_ee8 = local_230.begin.y;
            local_f58 = local_230.begin.z;
            local_9a0 = local_270.p;
            local_9a8 = local_270.jstride;
            local_b68 = local_270.kstride;
            local_eec = local_270.begin.y;
            local_f5c = local_270.begin.z;
            local_9b0 = local_4b0.p;
            local_9b8 = local_4b0.jstride;
            local_b70 = local_4b0.kstride;
            local_800 = local_4b0.nstride;
            local_ef0 = local_4b0.begin.y;
            local_f60 = local_4b0.begin.z;
            local_9c0 = local_4f0.p;
            local_9c8 = local_4f0.jstride;
            local_b78 = local_4f0.kstride;
            local_808 = local_4f0.nstride;
            local_9d0 = (long)local_4f0.begin.y;
            local_f64 = local_4f0.begin.z;
            local_9d8 = local_530.p;
            local_9e0 = local_530.jstride;
            local_b80 = local_530.kstride;
            local_810 = local_530.nstride;
            local_ef4 = local_530.begin.y;
            local_b88 = (long)local_530.begin.z;
            local_9e8 = local_2b0.p;
            local_9f0 = local_2b0.jstride;
            local_b90 = local_2b0.kstride;
            local_9f8 = (long)local_2b0.begin.y;
            local_b98 = (long)local_2b0.begin.z;
            local_ba0 = local_2f0.p;
            local_a00 = local_2f0.jstride;
            local_ba8 = local_2f0.kstride;
            local_ef8 = local_2f0.begin.y;
            local_bb0 = (long)local_2f0.begin.z;
            local_a08 = local_330.p;
            local_a10 = local_330.jstride;
            local_bb8 = local_330.kstride;
            local_a18 = (long)local_330.begin.y;
            local_f68 = local_330.begin.z;
            local_a20 = local_370.p;
            local_a28 = local_370.jstride;
            local_bc0 = local_370.kstride;
            local_efc = local_370.begin.y;
            local_f6c = local_370.begin.z;
            local_fe8 = (ulong)(uint)local_64c.smallend.vect[0];
            local_818 = (ulong)(uint)local_64c.bigend.vect[0];
            local_1150 = local_64c.bigend.vect[1];
            iVar110 = local_cd4.smallend.vect[0] - 2;
            iVar79 = local_cd4.smallend.vect[1] + -2;
            iVar80 = local_cd4.smallend.vect[2] + -2;
            local_788 = local_3f0.nstride;
            local_7a0 = local_3f0.nstride * 2;
            local_790 = local_430.nstride;
            local_7a8 = local_430.nstride * 2;
            local_798 = local_470.nstride;
            local_7b0 = local_470.nstride * 2;
            local_1160 = CONCAT44(local_1160._4_4_,local_64c.bigend.vect[0] + 1);
            iVar38 = local_64c.smallend.vect[0] * 2;
            uVar28 = 0;
            local_1154 = local_64c.smallend.vect[1];
            uVar59 = local_64c.smallend.vect[2];
            do {
              uVar107 = (ulong)uVar59;
              uVar60 = uVar59;
              if (local_1154 <= local_1150) {
                iVar17 = (int)((long)(int)uVar59 * 2);
                iVar39 = iVar17 + 1;
                lVar66 = (iVar17 - local_f6c) * local_bc0;
                lVar32 = (iVar39 - local_f6c) * local_bc0;
                local_828 = local_b20 + (int)(uVar59 - local_f3c) * local_b28;
                local_830 = local_a40 + (long)(int)(uVar59 - local_f04) * (long)local_a48;
                local_838 = local_a50 + (int)(uVar59 - local_f08) * local_a58 * 2;
                local_840 = local_a60 + (int)(uVar59 - local_f0c) * local_a68;
                local_848 = local_a70 + (int)(uVar59 - local_f10) * local_a78 * 8;
                local_850 = local_a80 + (int)(uVar59 - local_f14) * local_a88;
                local_738 = (iVar17 - local_f40) * local_b30;
                local_740 = (iVar39 - local_f40) * local_b30;
                local_748 = (iVar17 - local_f44) * local_b38;
                local_750 = (iVar39 - local_f44) * local_b38;
                local_758 = (iVar17 - local_f48) * local_b40;
                local_760 = (iVar39 - local_f48) * local_b40;
                local_768 = (iVar17 - local_f4c) * local_b48;
                local_770 = (iVar39 - local_f4c) * local_b48;
                local_778 = (iVar17 - local_f50) * local_b50;
                local_780 = (iVar39 - local_f50) * local_b50;
                lVar96 = (iVar17 - local_f54) * local_b58;
                local_d60 = (iVar39 - local_f54) * local_b58;
                lVar101 = (iVar17 - local_f58) * local_b60;
                local_d68 = (iVar39 - local_f58) * local_b60;
                local_d70 = local_b68 * (iVar17 - local_f5c);
                local_d78 = ((iVar17 - local_f5c) + 2) * local_b68;
                local_858 = local_a90 + (int)(uVar59 - local_f18) * local_a98;
                local_860 = (long)local_ac0 +
                            ((int)(uVar59 - local_f24) * local_ac8 * 2 + -1) * 4 + 4;
                local_7e0 = (iVar17 - local_f60) * local_b70;
                local_7e8 = (iVar39 - local_f60) * local_b70;
                local_868 = local_aa0 + (int)(uVar59 - local_f1c) * local_aa8;
                local_870 = local_ad0 + (int)(uVar59 - local_f28) * local_ad8;
                local_7f0 = (iVar17 - local_f64) * local_b78;
                local_7f8 = (iVar39 - local_f64) * local_b78;
                local_878 = local_ab0 + (int)(uVar59 - local_f20) * local_ab8;
                local_880 = local_ae0 + (int)(uVar59 - local_f2c) * local_ae8;
                local_820 = ((long)(int)uVar59 * 2 - local_b88) * local_b80;
                local_888 = (iVar17 - local_b98) * local_b90;
                local_890 = local_af0 + (int)(uVar59 - local_f30) * local_af8;
                local_898 = local_ba0 + (iVar17 - local_bb0) * local_ba8;
                local_8a0 = local_b00 + (int)(uVar59 - local_f34) * local_b08;
                local_728 = (iVar17 - local_f68) * local_bb8;
                local_730 = (iVar39 - local_f68) * local_bb8;
                local_8a8 = local_b10 + (int)(uVar59 - local_f38) * local_b18;
                uVar70 = local_fd8;
                local_fc8 = uVar107;
                iVar17 = local_1154;
                do {
                  pdVar67 = local_980;
                  lVar55 = local_d70;
                  if ((int)local_fe8 <= (int)local_818) {
                    iVar39 = (int)((long)iVar17 * 2);
                    iVar95 = iVar39 + 1;
                    local_f90 = local_a20 + (iVar39 - local_efc) * local_a28;
                    local_1140 = local_a20 + (iVar95 - local_efc) * local_a28;
                    local_fd0 = local_828 + (iVar17 - local_ecc) * local_928;
                    local_10c0 = local_830 + (long)(iVar17 - local_e94) * (long)local_8b8;
                    local_10c8 = local_838 + (iVar17 - local_e98) * local_8c0 * 2;
                    local_10d0 = local_840 + (iVar17 - local_e9c) * local_8c8;
                    local_10d8 = local_848 + (iVar17 - local_ea0) * local_8d0 * 8;
                    local_10e0 = local_850 + (iVar17 - local_ea4) * local_8d8;
                    local_6d8 = local_930 + (iVar39 - local_ed0) * local_938;
                    local_6e0 = local_930 + (iVar95 - local_ed0) * local_938;
                    local_6e8 = local_940 + (iVar39 - local_ed4) * local_948;
                    local_6f0 = local_940 + (iVar95 - local_ed4) * local_948;
                    local_6f8 = local_950 + (iVar39 - local_ed8) * local_958;
                    local_700 = local_950 + (iVar95 - local_ed8) * local_958;
                    local_708 = local_960 + (iVar39 - local_edc) * local_968;
                    local_710 = local_960 + (iVar95 - local_edc) * local_968;
                    local_718 = local_970 + (iVar39 - local_ee0) * local_978;
                    local_720 = local_970 + (iVar95 - local_ee0) * local_978;
                    lVar62 = (iVar39 - local_ee4) * local_988;
                    local_d50 = local_980 + (iVar95 - local_ee4) * local_988;
                    local_d58 = local_990 + local_998 * (iVar39 - local_ee8);
                    local_8b0 = local_990 + ((iVar39 - local_ee8) + 2) * local_998;
                    pdVar33 = local_9a0 + (iVar39 - local_eec) * local_9a8;
                    pdVar2 = local_9a0 + (iVar95 - local_eec) * local_9a8;
                    local_d20 = local_858 + (iVar17 - local_ea8) * local_8e0;
                    local_f98 = local_860 + (long)(iVar17 - local_eb4) * (long)local_8f8 * 8;
                    local_7b8 = local_9b0 + (iVar39 - local_ef0) * local_9b8;
                    local_7c0 = local_9b0 + (iVar95 - local_ef0) * local_9b8;
                    local_d28 = local_868 + (iVar17 - local_eac) * local_8e8;
                    local_fa0 = local_870 + (iVar17 - local_eb8) * local_900;
                    local_7c8 = local_9c0 + ((long)iVar17 * 2 - local_9d0) * local_9c8;
                    local_d30 = local_878 + (long)(iVar17 - local_eb0) * (long)local_8f0;
                    local_fa8 = local_880 + (iVar17 - local_ebc) * local_908;
                    local_7d0 = local_9d8 + (iVar39 - local_ef4) * local_9e0 + local_820;
                    local_7d8 = local_9d8 + (iVar95 - local_ef4) * local_9e0 + local_820;
                    local_6b8 = local_9e8 + (iVar39 - local_9f8) * local_9f0 + local_888;
                    local_670 = local_890 + (iVar17 - local_ec0) * local_910;
                    local_6c0 = local_898 + (iVar39 - local_ef8) * local_a00;
                    local_6c8 = local_898 + (iVar95 - local_ef8) * local_a00;
                    local_678 = local_8a0 + (iVar17 - local_ec4) * local_918;
                    local_6d0 = local_a08 + (iVar39 - local_a18) * local_a10;
                    local_680 = local_8a8 + (iVar17 - local_ec8) * local_920;
                    uVar102 = local_fe8;
                    uVar107 = local_fc8;
                    iVar39 = local_e68;
                    iVar95 = local_e5c;
                    iVar82 = local_e90;
                    local_a38 = pdVar2;
                    local_a30 = pdVar33;
                    iVar54 = local_e8c;
                    iVar53 = local_e88;
                    iVar52 = local_e84;
                    iVar51 = local_e80;
                    iVar50 = local_e7c;
                    iVar49 = local_e78;
                    iVar48 = local_e74;
                    iVar47 = local_e70;
                    iVar46 = local_e6c;
                    iVar45 = local_e64;
                    iVar44 = local_e60;
                    iVar43 = local_e58;
                    uVar59 = uVar28;
                    do {
                      iVar100 = (int)uVar102;
                      iVar81 = (int)uVar107;
                      iVar40 = (int)local_1138;
                      iVar41 = (int)local_1130;
                      iVar42 = (int)local_1128;
                      iVar69 = (int)local_1120;
                      iVar106 = (int)local_1118;
                      if ((iVar100 < (int)uVar70) ||
                         (((iVar81 < iVar87 || iVar17 < iVar78) ||
                          (iVar105 < iVar100 || iVar109 < iVar17)) || iVar18 < iVar81)) {
                        uVar28 = 0;
                        if ((iVar110 <= iVar100) &&
                           (((iVar80 <= iVar81 && iVar79 <= iVar17) &&
                            (iVar100 <= iVar75 && iVar17 <= iVar88)) && iVar81 <= iVar91)) {
                          local_10c0[iVar40 + iVar100] = (_func_int *)0x3ff0000000000000;
                          lVar56 = (long)(iVar41 + iVar100);
                          *(undefined8 *)(local_10c8 + lVar56 * 2) = 0;
                          *(undefined8 *)(local_10c8 + lVar56 * 2 + local_10e8 * 2) = 0;
                          *(undefined8 *)((long)&local_10c8[lVar56 * 2].flag + local_10f0) = 0;
                          local_10d0[iVar42 + iVar100] = (undefined *)0x0;
                          *(undefined8 *)(local_10d8 + (long)(iVar69 + iVar100) * 8) =
                               0xbff0000000000000;
                          lVar56 = local_10d8 + (long)(iVar69 + iVar100) * 8;
                          *(undefined8 *)(lVar56 + local_10f8 * 8) = 0xbff0000000000000;
                          *(undefined8 *)(local_1100 + lVar56) = 0xbff0000000000000;
                          lVar56 = (long)(iVar106 + iVar100);
                          local_10e0[lVar56] = 0.0;
                          local_10e0[lVar56 + local_1108] = 0.0;
                          uVar28 = 0;
                          *(undefined8 *)((long)local_10e0 + local_1110 + lVar56 * 8) = 0;
                        }
                      }
                      else {
                        lVar56 = (long)(iVar44 + iVar38);
                        uVar28 = local_f90[lVar56 + lVar66].flag & 3;
                        iVar81 = (int)local_fe0;
                        if (uVar28 == 3) {
                          lVar83 = (long)(iVar44 + iVar38 + 1);
                          if (((((~local_f90[lVar83 + lVar66].flag & 3) == 0) &&
                               ((~local_1140[lVar56 + lVar66].flag & 3) == 0)) &&
                              ((~local_1140[lVar83 + lVar66].flag & 3) == 0)) &&
                             ((((~local_f90[lVar56 + lVar32].flag & 3) == 0 &&
                               ((~local_f90[lVar83 + lVar32].flag & 3) == 0)) &&
                              (((~local_1140[lVar56 + lVar32].flag & 3) == 0 &&
                               ((~local_1140[lVar83 + lVar32].flag & 3) == 0)))))) {
                            local_fd0[iVar81 + iVar100].flag = 0x40003;
                            local_10c0[iVar40 + iVar100] = (_func_int *)0x0;
                            lVar56 = (long)(iVar41 + iVar100);
                            *(undefined8 *)(local_10c8 + lVar56 * 2) = 0;
                            *(undefined8 *)(local_10c8 + lVar56 * 2 + local_10e8 * 2) = 0;
                            *(undefined8 *)((long)&local_10c8[lVar56 * 2].flag + local_10f0) = 0;
                            local_10d0[iVar42 + iVar100] = (undefined *)0x0;
                            *(undefined8 *)(local_10d8 + (long)(iVar69 + iVar100) * 8) =
                                 0xbff0000000000000;
                            lVar56 = local_10d8 + (long)(iVar69 + iVar100) * 8;
                            *(undefined8 *)(lVar56 + local_10f8 * 8) = 0xbff0000000000000;
                            *(undefined8 *)(local_1100 + lVar56) = 0xbff0000000000000;
                            lVar56 = (long)(iVar106 + iVar100);
                            local_10e0[lVar56] = 0.0;
                            local_10e0[lVar56 + local_1108] = 0.0;
                            *(undefined8 *)((long)local_10e0 + local_1110 + lVar56 * 8) = 0;
LAB_0063599a:
                            uVar28 = 0;
                            goto LAB_00636b51;
                          }
                        }
                        else if (uVar28 == 0) {
                          lVar83 = (long)(iVar44 + iVar38 + 1);
                          if ((((local_f90[lVar83 + lVar66].flag & 3) == 0) &&
                              ((local_1140[lVar56 + lVar66].flag & 3) == 0)) &&
                             (((local_1140[lVar83 + lVar66].flag & 3) == 0 &&
                              (((((local_f90[lVar56 + lVar32].flag & 3) == 0 &&
                                 ((local_f90[lVar83 + lVar32].flag & 3) == 0)) &&
                                ((local_1140[lVar56 + lVar32].flag & 3) == 0)) &&
                               ((local_1140[lVar83 + lVar32].flag & 3) == 0)))))) {
                            local_fd0[iVar81 + iVar100].flag =
                                 local_fd0[iVar81 + iVar100].flag & 0xffffffe0 | 4;
                            local_10c0[iVar40 + iVar100] = (_func_int *)0x3ff0000000000000;
                            lVar56 = (long)(iVar41 + iVar100);
                            *(undefined8 *)(local_10c8 + lVar56 * 2) = 0;
                            *(undefined8 *)(local_10c8 + lVar56 * 2 + local_10e8 * 2) = 0;
                            *(undefined8 *)((long)&local_10c8[lVar56 * 2].flag + local_10f0) = 0;
                            local_10d0[iVar42 + iVar100] = (undefined *)0x0;
                            *(undefined8 *)(local_10d8 + (long)(iVar69 + iVar100) * 8) =
                                 0xbff0000000000000;
                            lVar56 = local_10d8 + (long)(iVar69 + iVar100) * 8;
                            *(undefined8 *)(lVar56 + local_10f8 * 8) = 0xbff0000000000000;
                            *(undefined8 *)(local_1100 + lVar56) = 0xbff0000000000000;
                            lVar56 = (long)(iVar106 + iVar100);
                            local_10e0[lVar56] = 0.0;
                            local_10e0[lVar56 + local_1108] = 0.0;
                            *(undefined8 *)((long)local_10e0 + local_1110 + lVar56 * 8) = 0;
                            goto LAB_0063599a;
                          }
                        }
                        local_fd0[iVar81 + iVar100].flag =
                             local_fd0[iVar81 + iVar100].flag & 0xffffffe0 | 5;
                        lVar56 = (long)(iVar38 + iVar50);
                        lVar83 = (long)(iVar38 + 1 + iVar50);
                        p_Var113 = (_func_int *)
                                   ((local_6d8[lVar56 + local_738] + local_6d8[lVar83 + local_738] +
                                     local_6e0[lVar56 + local_738] + local_6e0[lVar83 + local_738] +
                                     local_6d8[lVar56 + local_740] + local_6d8[lVar83 + local_740] +
                                     local_6e0[lVar56 + local_740] + local_6e0[lVar83 + local_740])
                                   * 0.125);
                        local_10c0[iVar40 + iVar100] = p_Var113;
                        dVar115 = (1.0 / (double)p_Var113) * 0.125;
                        lVar76 = (long)(iVar38 + iVar49);
                        pdVar122 = local_6e8 + lVar76 + local_748;
                        lVar92 = (long)(iVar38 + 1 + iVar49);
                        pdVar117 = local_6e8 + lVar92 + local_748;
                        pdVar3 = local_6f0 + lVar76 + local_748;
                        pdVar4 = local_6f0 + lVar92 + local_748;
                        pdVar5 = local_6e8 + lVar76 + local_750;
                        pdVar6 = local_6e8 + lVar92 + local_750;
                        pdVar7 = local_6f0 + lVar76 + local_750;
                        pdVar8 = local_6f0 + lVar92 + local_750;
                        lVar76 = (long)(iVar41 + iVar100);
                        *(double *)(local_10c8 + lVar76 * 2) =
                             ((*pdVar8 * 0.5 + 0.25) * local_6e0[lVar83 + local_740] +
                             (*pdVar7 * 0.5 + -0.25) * local_6e0[lVar56 + local_740] +
                             (*pdVar6 * 0.5 + 0.25) * local_6d8[lVar83 + local_740] +
                             (*pdVar5 * 0.5 + -0.25) * local_6d8[lVar56 + local_740] +
                             (*pdVar4 * 0.5 + 0.25) * local_6e0[lVar83 + local_738] +
                             (*pdVar3 * 0.5 + -0.25) * local_6e0[lVar56 + local_738] +
                             (*pdVar122 * 0.5 + -0.25) * local_6d8[lVar56 + local_738] +
                             (*pdVar117 * 0.5 + 0.25) * local_6d8[lVar83 + local_738]) * dVar115;
                        *(double *)(local_10c8 + lVar76 * 2 + local_10e8 * 2) =
                             ((pdVar8[local_788] * 0.5 + 0.25) * local_6e0[lVar83 + local_740] +
                             (pdVar7[local_788] * 0.5 + 0.25) * local_6e0[lVar56 + local_740] +
                             (pdVar6[local_788] * 0.5 + -0.25) * local_6d8[lVar83 + local_740] +
                             (pdVar5[local_788] * 0.5 + -0.25) * local_6d8[lVar56 + local_740] +
                             (pdVar4[local_788] * 0.5 + 0.25) * local_6e0[lVar83 + local_738] +
                             (pdVar3[local_788] * 0.5 + 0.25) * local_6e0[lVar56 + local_738] +
                             (pdVar122[local_788] * 0.5 + -0.25) * local_6d8[lVar56 + local_738] +
                             (pdVar117[local_788] * 0.5 + -0.25) * local_6d8[lVar83 + local_738]) *
                             dVar115;
                        *(double *)((long)&local_10c8[lVar76 * 2].flag + local_10f0) =
                             ((pdVar8[local_7a0] * 0.5 + 0.25) * local_6e0[lVar83 + local_740] +
                             (pdVar7[local_7a0] * 0.5 + 0.25) * local_6e0[lVar56 + local_740] +
                             (pdVar6[local_7a0] * 0.5 + 0.25) * local_6d8[lVar83 + local_740] +
                             (pdVar5[local_7a0] * 0.5 + 0.25) * local_6d8[lVar56 + local_740] +
                             (pdVar4[local_7a0] * 0.5 + -0.25) * local_6e0[lVar83 + local_738] +
                             (pdVar3[local_7a0] * 0.5 + -0.25) * local_6e0[lVar56 + local_738] +
                             (pdVar122[local_7a0] * 0.5 + -0.25) * local_6d8[lVar56 + local_738] +
                             (pdVar117[local_7a0] * 0.5 + -0.25) * local_6d8[lVar83 + local_738]) *
                             dVar115;
                        lVar83 = (long)(iVar38 + iVar48);
                        lVar76 = (long)(iVar38 + 1 + iVar48);
                        puVar114 = (undefined *)
                                   ((local_6f8[lVar83 + local_758] + local_6f8[lVar76 + local_758] +
                                     local_700[lVar83 + local_758] + local_700[lVar76 + local_758] +
                                     local_6f8[lVar83 + local_760] + local_6f8[lVar76 + local_760] +
                                     local_700[lVar83 + local_760] + local_700[lVar76 + local_760])
                                   * 0.25);
                        local_10d0[iVar42 + iVar100] = puVar114;
                        lVar92 = (long)(iVar38 + iVar47);
                        pdVar122 = local_708 + lVar92 + local_768;
                        lVar56 = (long)(iVar38 + 1 + iVar47);
                        local_660 = local_708 + lVar56 + local_768;
                        dVar115 = (1.0 / (double)puVar114) * 0.25;
                        local_1078 = local_710 + lVar92 + local_768;
                        local_668 = local_710 + lVar56 + local_768;
                        local_f78 = local_708 + lVar92 + local_770;
                        local_f80 = local_708 + lVar56 + local_770;
                        local_f88 = local_710 + lVar92 + local_770;
                        local_658 = local_710 + lVar56 + local_770;
                        *(double *)(local_10d8 + (long)(iVar69 + iVar100) * 8) =
                             ((*local_658 * 0.5 + 0.25) * local_700[lVar76 + local_760] +
                             (*local_f88 * 0.5 + -0.25) * local_700[lVar83 + local_760] +
                             (*local_f80 * 0.5 + 0.25) * local_6f8[lVar76 + local_760] +
                             (*local_f78 * 0.5 + -0.25) * local_6f8[lVar83 + local_760] +
                             (*local_668 * 0.5 + 0.25) * local_700[lVar76 + local_758] +
                             (*local_1078 * 0.5 + -0.25) * local_700[lVar83 + local_758] +
                             (*pdVar122 * 0.5 + -0.25) * local_6f8[lVar83 + local_758] +
                             (*local_660 * 0.5 + 0.25) * local_6f8[lVar76 + local_758]) * dVar115;
                        lVar56 = local_10d8 + (long)(iVar69 + iVar100) * 8;
                        *(double *)(lVar56 + local_10f8 * 8) =
                             ((local_658[local_790] * 0.5 + 0.25) * local_700[lVar76 + local_760] +
                             (local_f88[local_790] * 0.5 + 0.25) * local_700[lVar83 + local_760] +
                             (local_f80[local_790] * 0.5 + -0.25) * local_6f8[lVar76 + local_760] +
                             (local_f78[local_790] * 0.5 + -0.25) * local_6f8[lVar83 + local_760] +
                             (local_668[local_790] * 0.5 + 0.25) * local_700[lVar76 + local_758] +
                             (local_1078[local_790] * 0.5 + 0.25) * local_700[lVar83 + local_758] +
                             (pdVar122[local_790] * 0.5 + -0.25) * local_6f8[lVar83 + local_758] +
                             (local_660[local_790] * 0.5 + -0.25) * local_6f8[lVar76 + local_758]) *
                             dVar115;
                        *(double *)(local_1100 + lVar56) =
                             ((local_658[local_7a8] * 0.5 + 0.25) * local_700[lVar76 + local_760] +
                             (local_f88[local_7a8] * 0.5 + 0.25) * local_700[lVar83 + local_760] +
                             (local_f80[local_7a8] * 0.5 + 0.25) * local_6f8[lVar76 + local_760] +
                             (local_f78[local_7a8] * 0.5 + 0.25) * local_6f8[lVar83 + local_760] +
                             (local_668[local_7a8] * 0.5 + -0.25) * local_700[lVar76 + local_758] +
                             (local_1078[local_7a8] * 0.5 + -0.25) * local_700[lVar83 + local_758] +
                             (pdVar122[local_7a8] * 0.5 + -0.25) * local_6f8[lVar83 + local_758] +
                             (local_660[local_7a8] * 0.5 + -0.25) * local_6f8[lVar76 + local_758]) *
                             dVar115;
                        lVar92 = (long)(iVar38 + iVar46);
                        pdVar122 = local_718 + lVar92 + local_778;
                        dVar115 = local_6f8[lVar83 + local_758];
                        lVar56 = (long)(iVar38 + 1 + iVar46);
                        dVar116 = local_6f8[lVar83 + local_760];
                        dVar14 = local_6f8[lVar76 + local_758];
                        dVar9 = local_6f8[lVar76 + local_760];
                        pdVar117 = local_718 + lVar56 + local_778;
                        dVar10 = local_700[lVar83 + local_758];
                        dVar11 = local_700[lVar83 + local_760];
                        pdVar3 = local_720 + lVar92 + local_778;
                        dVar12 = local_700[lVar76 + local_758];
                        dVar13 = local_700[lVar76 + local_760];
                        pdVar4 = local_720 + lVar56 + local_778;
                        pdVar5 = local_718 + lVar92 + local_780;
                        pdVar6 = local_718 + lVar56 + local_780;
                        pdVar7 = local_720 + lVar92 + local_780;
                        pdVar8 = local_720 + lVar56 + local_780;
                        dVar119 = *pdVar8 * dVar13 +
                                  *pdVar7 * dVar11 +
                                  *pdVar6 * dVar9 +
                                  *pdVar5 * dVar116 +
                                  *pdVar4 * dVar12 +
                                  *pdVar3 * dVar10 + *pdVar122 * dVar115 + *pdVar117 * dVar14;
                        dVar121 = dVar13 * pdVar8[local_7b0] +
                                  dVar11 * pdVar7[local_7b0] +
                                  dVar9 * pdVar6[local_7b0] +
                                  dVar116 * pdVar5[local_7b0] +
                                  dVar12 * pdVar4[local_7b0] +
                                  dVar10 * pdVar3[local_7b0] +
                                  dVar115 * pdVar122[local_7b0] + pdVar117[local_7b0] * dVar14;
                        pdVar122 = (double *)
                                   (dVar13 * pdVar8[local_798] +
                                   dVar11 * pdVar7[local_798] +
                                   dVar9 * pdVar6[local_798] +
                                   dVar116 * pdVar5[local_798] +
                                   dVar12 * pdVar4[local_798] +
                                   dVar10 * pdVar3[local_798] +
                                   dVar115 * pdVar122[local_798] + pdVar117[local_798] * dVar14);
                        dVar115 = dVar121 * dVar121 +
                                  dVar119 * dVar119 + (double)pdVar122 * (double)pdVar122 + 1e-30;
                        if (dVar115 < 0.0) {
                          local_1078 = pdVar122;
                          pdStack_1070 = pdVar122;
                          dVar115 = sqrt(dVar115);
                          pdVar117 = local_1078;
                        }
                        else {
                          dVar115 = SQRT(dVar115);
                          pdVar117 = pdVar122;
                        }
                        pdVar3 = local_10e0 + ((int)local_1118 + iVar100);
                        dVar115 = 1.0 / dVar115;
                        *pdVar3 = dVar119 * dVar115;
                        pdVar3[local_1108] = (double)pdVar117 * dVar115;
                        *(double *)((long)pdVar3 + local_1110) = dVar115 * dVar121;
                        uVar70 = local_fd8;
                        uVar107 = local_fc8;
                        if (((dVar119 != 0.0) || (NAN(dVar119))) ||
                           ((auVar112._8_8_ = -(ulong)((double)pdVar122 == 0.0),
                            auVar112._0_8_ = -(ulong)(dVar121 == 0.0),
                            uVar60 = movmskpd((int)local_1110,auVar112),
                            (byte)((byte)uVar60 >> 1) == 0 || (uVar28 = 1, (uVar60 & 1) == 0)))) {
                          lVar56 = (long)(iVar38 + iVar95);
                          uVar28 = 0;
                          if ((pdVar67[lVar62 + lVar56 + lVar96] == 1.0) &&
                             (!NAN(pdVar67[lVar62 + lVar56 + lVar96]))) {
                            lVar83 = (long)(iVar38 + iVar95 + 2);
                            if ((pdVar67[lVar62 + lVar83 + lVar96] == 1.0) &&
                               (!NAN(pdVar67[lVar62 + lVar83 + lVar96]))) {
                              if ((local_d50[lVar56 + lVar96] == 1.0) &&
                                 (!NAN(local_d50[lVar56 + lVar96]))) {
                                if (((((local_d50[lVar83 + lVar96] == 1.0) &&
                                      (((!NAN(local_d50[lVar83 + lVar96]) &&
                                        (pdVar67[lVar62 + lVar56 + local_d60] == 1.0)) &&
                                       (!NAN(pdVar67[lVar62 + lVar56 + local_d60]))))) &&
                                     (((pdVar67[lVar62 + lVar83 + local_d60] == 1.0 &&
                                       (!NAN(pdVar67[lVar62 + lVar83 + local_d60]))) &&
                                      (local_d50[lVar56 + local_d60] == 1.0)))) &&
                                    ((!NAN(local_d50[lVar56 + local_d60]) &&
                                     (local_d50[lVar83 + local_d60] == 1.0)))) &&
                                   (!NAN(local_d50[lVar83 + local_d60]))) {
                                  lVar56 = (long)(iVar38 + iVar39);
                                  if ((local_d58[lVar56 + lVar101] == 1.0) &&
                                     (!NAN(local_d58[lVar56 + lVar101]))) {
                                    lVar83 = (long)(iVar38 + iVar39 + 1);
                                    if ((local_d58[lVar83 + lVar101] == 1.0) &&
                                       (!NAN(local_d58[lVar83 + lVar101]))) {
                                      if ((local_8b0[lVar56 + lVar101] == 1.0) &&
                                         (!NAN(local_8b0[lVar56 + lVar101]))) {
                                        if ((local_8b0[lVar83 + lVar101] == 1.0) &&
                                           ((((!NAN(local_8b0[lVar83 + lVar101]) &&
                                              (local_d58[lVar56 + local_d68] == 1.0)) &&
                                             (!NAN(local_d58[lVar56 + local_d68]))) &&
                                            ((((local_d58[lVar83 + local_d68] == 1.0 &&
                                               (!NAN(local_d58[lVar83 + local_d68]))) &&
                                              ((local_8b0[lVar56 + local_d68] == 1.0 &&
                                               ((!NAN(local_8b0[lVar56 + local_d68]) &&
                                                (local_8b0[lVar83 + local_d68] == 1.0)))))) &&
                                             (!NAN(local_8b0[lVar83 + local_d68]))))))) {
                                          lVar56 = (long)(iVar38 + iVar45);
                                          if ((local_a30[lVar56 + local_d70] == 1.0) &&
                                             (!NAN(local_a30[lVar56 + local_d70]))) {
                                            lVar83 = (long)(iVar38 + iVar45 + 1);
                                            if ((local_a30[lVar83 + local_d70] == 1.0) &&
                                               (!NAN(local_a30[lVar83 + local_d70]))) {
                                              if ((local_a38[lVar56 + local_d70] == 1.0) &&
                                                 (!NAN(local_a38[lVar56 + local_d70]))) {
                                                if ((local_a38[lVar83 + local_d70] == 1.0) &&
                                                   (((((!NAN(local_a38[lVar83 + local_d70]) &&
                                                       (local_a30[lVar56 + local_d78] == 1.0)) &&
                                                      (!NAN(local_a30[lVar56 + local_d78]))) &&
                                                     ((local_a30[lVar83 + local_d78] == 1.0 &&
                                                      (!NAN(local_a30[lVar83 + local_d78]))))) &&
                                                    ((local_a38[lVar56 + local_d78] == 1.0 &&
                                                     (!NAN(local_a38[lVar56 + local_d78]))))))) {
                                                  uVar28 = -(uint)(local_a38[lVar83 + local_d78] ==
                                                                  1.0) & 1;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
LAB_00636b51:
                      iVar69 = (int)uVar70;
                      iVar106 = (int)uVar107;
                      iVar42 = (int)local_fb0;
                      if ((iVar100 < iVar69) ||
                         (((iVar106 < iVar87 || iVar17 < iVar78) ||
                          (iVar30 < iVar100 || iVar109 < iVar17)) || iVar18 < iVar106)) {
                        if ((iVar110 <= iVar100) &&
                           (((iVar80 <= iVar106 && iVar79 <= iVar17) &&
                            (iVar100 <= local_e3c && iVar17 <= iVar88)) && iVar106 <= iVar91)) {
                          local_d20[(int)local_d38 + iVar100] = 1.0;
                          pdVar122 = (double *)(local_f98 + (long)(iVar42 + iVar100) * 8);
                          *pdVar122 = 0.0;
                          dVar115 = 0.0;
                          goto LAB_00636e2f;
                        }
                      }
                      else {
                        lVar56 = (long)(iVar95 + iVar38);
                        dVar115 = (pdVar67[lVar62 + lVar56 + lVar96] + local_d50[lVar56 + lVar96] +
                                   pdVar67[lVar62 + lVar56 + local_d60] +
                                  local_d50[lVar56 + local_d60]) * 0.25;
                        local_d20[(int)local_d38 + iVar100] = dVar115;
                        if ((dVar115 != 0.0) || (NAN(dVar115))) {
                          dVar115 = (1.0 / dVar115) * 0.25;
                          lVar83 = (long)(iVar51 + iVar38);
                          pdVar122 = (double *)(local_f98 + (long)(iVar42 + iVar100) * 8);
                          *pdVar122 = ((local_7c0[lVar83 + local_7e8] * 0.5 + 0.25) *
                                       local_d50[lVar56 + local_d60] +
                                      (local_7b8[lVar83 + local_7e8] * 0.5 + -0.25) *
                                      pdVar67[lVar62 + lVar56 + local_d60] +
                                      (local_7b8[lVar83 + local_7e0] * 0.5 + -0.25) *
                                      pdVar67[lVar62 + lVar56 + lVar96] +
                                      (local_7c0[lVar83 + local_7e0] * 0.5 + 0.25) *
                                      local_d50[lVar56 + lVar96]) * dVar115;
                          dVar115 = (((local_7c0 + lVar83 + local_7e8)[local_800] * 0.5 + 0.25) *
                                     local_d50[lVar56 + local_d60] +
                                    ((local_7b8 + lVar83 + local_7e8)[local_800] * 0.5 + 0.25) *
                                    pdVar67[lVar62 + lVar56 + local_d60] +
                                    ((local_7b8 + lVar83 + local_7e0)[local_800] * 0.5 + -0.25) *
                                    pdVar67[lVar62 + lVar56 + lVar96] +
                                    ((local_7c0 + lVar83 + local_7e0)[local_800] * 0.5 + -0.25) *
                                    local_d50[lVar56 + lVar96]) * dVar115;
                        }
                        else {
                          pdVar122 = (double *)(local_f98 + (long)(iVar42 + iVar100) * 8);
                          *pdVar122 = 0.0;
                          dVar115 = 0.0;
                        }
LAB_00636e2f:
                        pdVar122[local_6a0] = dVar115;
                      }
                      iVar42 = (int)local_fb8;
                      if ((iVar100 < iVar69) ||
                         (((iVar106 < iVar87 || iVar17 < iVar78) ||
                          (iVar105 < iVar100 || local_e2c < iVar17)) || iVar18 < iVar106)) {
                        if ((iVar110 <= iVar100) &&
                           (((iVar80 <= iVar106 && iVar79 <= iVar17) &&
                            (iVar100 <= iVar75 && iVar17 <= local_e40)) && iVar106 <= iVar91)) {
                          local_d28[(int)local_d40 + iVar100] = 1.0;
                          pdVar122 = local_fa0 + (iVar42 + iVar100);
                          *pdVar122 = 0.0;
                          dVar115 = 0.0;
                          goto LAB_00637138;
                        }
                      }
                      else {
                        iVar40 = iVar38 + iVar39;
                        iVar41 = iVar38 + 1 + iVar39;
                        dVar115 = (local_d58[iVar40 + lVar101] + local_d58[iVar41 + lVar101] +
                                   local_d58[iVar40 + local_d68] + local_d58[iVar41 + local_d68]) *
                                  0.25;
                        local_d28[(int)local_d40 + iVar100] = dVar115;
                        if ((dVar115 != 0.0) || (NAN(dVar115))) {
                          dVar115 = (1.0 / dVar115) * 0.25;
                          iVar81 = iVar38 + 1 + iVar52;
                          pdVar122 = local_fa0 + (iVar42 + iVar100);
                          *pdVar122 = ((local_7c8[iVar81 + local_7f8] * 0.5 + 0.25) *
                                       local_d58[iVar41 + local_d68] +
                                      (local_7c8[(iVar38 + iVar52) + local_7f8] * 0.5 + -0.25) *
                                      local_d58[iVar40 + local_d68] +
                                      (local_7c8[(iVar38 + iVar52) + local_7f0] * 0.5 + -0.25) *
                                      local_d58[iVar40 + lVar101] +
                                      (local_7c8[iVar81 + local_7f0] * 0.5 + 0.25) *
                                      local_d58[iVar41 + lVar101]) * dVar115;
                          dVar115 = (((local_7c8 + iVar81 + local_7f8)[local_808] * 0.5 + 0.25) *
                                     local_d58[iVar41 + local_d68] +
                                    ((local_7c8 + (iVar38 + iVar52) + local_7f8)[local_808] * 0.5 +
                                    0.25) * local_d58[iVar40 + local_d68] +
                                    ((local_7c8 + (iVar38 + iVar52) + local_7f0)[local_808] * 0.5 +
                                    -0.25) * local_d58[iVar40 + lVar101] +
                                    ((local_7c8 + iVar81 + local_7f0)[local_808] * 0.5 + -0.25) *
                                    local_d58[iVar41 + lVar101]) * dVar115;
                        }
                        else {
                          pdVar122 = local_fa0 + (iVar42 + iVar100);
                          *pdVar122 = 0.0;
                          dVar115 = 0.0;
                        }
LAB_00637138:
                        pdVar122[local_6a8] = dVar115;
                      }
                      iVar42 = (int)local_fc0;
                      if ((((iVar100 < iVar69) || (iVar105 < iVar100)) || (iVar17 < iVar78)) ||
                         (((iVar109 < iVar17 || (iVar106 < iVar87)) || (local_e38 < iVar106)))) {
                        if (((iVar110 <= iVar100) && (iVar100 <= iVar75)) &&
                           ((iVar79 <= iVar17 &&
                            (((iVar17 <= iVar88 && (iVar80 <= iVar106)) && (iVar106 <= local_e50))))
                           )) {
                          local_d30[(int)local_d48 + iVar100] = 1.0;
                          pdVar122 = local_fa8 + (iVar42 + iVar100);
                          *pdVar122 = 0.0;
                          dVar115 = 0.0;
                          goto LAB_00637433;
                        }
                      }
                      else {
                        lVar83 = (long)(iVar38 + iVar45);
                        lVar56 = (long)(iVar38 + 1 + iVar45);
                        dVar115 = (pdVar33[lVar55 + lVar83] + pdVar33[lVar55 + lVar56] +
                                   pdVar2[lVar55 + lVar83] + pdVar2[lVar55 + lVar56]) * 0.25;
                        local_d30[(int)local_d48 + iVar100] = dVar115;
                        if ((dVar115 != 0.0) || (NAN(dVar115))) {
                          dVar115 = (1.0 / dVar115) * 0.25;
                          lVar76 = (long)(iVar38 + iVar53);
                          iVar40 = iVar38 + 1 + iVar53;
                          pdVar122 = local_fa8 + (iVar42 + iVar100);
                          *pdVar122 = ((local_7d8[iVar40] * 0.5 + 0.25) * pdVar2[lVar55 + lVar56] +
                                      (local_7d8[lVar76] * 0.5 + -0.25) * pdVar2[lVar55 + lVar83] +
                                      (local_7d0[lVar76] * 0.5 + -0.25) * pdVar33[lVar55 + lVar83] +
                                      (local_7d0[iVar40] * 0.5 + 0.25) * pdVar33[lVar55 + lVar56]) *
                                      dVar115;
                          dVar115 = (((local_7d8 + iVar40)[local_810] * 0.5 + 0.25) *
                                     pdVar2[lVar55 + lVar56] +
                                    (local_7d8[lVar76 + local_810] * 0.5 + 0.25) *
                                    pdVar2[lVar55 + lVar83] +
                                    (local_7d0[lVar76 + local_810] * 0.5 + -0.25) *
                                    pdVar33[lVar55 + lVar83] +
                                    ((local_7d0 + iVar40)[local_810] * 0.5 + -0.25) *
                                    pdVar33[lVar55 + lVar56]) * dVar115;
                        }
                        else {
                          pdVar122 = local_fa8 + (iVar42 + iVar100);
                          *pdVar122 = 0.0;
                          dVar115 = 0.0;
                        }
LAB_00637433:
                        pdVar122[local_6b0] = dVar115;
                      }
                      if (((iVar100 < iVar69) || (local_e30 < iVar100)) ||
                         ((iVar17 < iVar78 ||
                          (((iVar61 < iVar17 || (iVar106 < iVar87)) || (iVar29 < iVar106)))))) {
                        if (((iVar110 <= iVar100) && (iVar100 <= local_e44)) &&
                           ((iVar79 <= iVar17 &&
                            (((iVar17 <= iVar73 && (iVar80 <= iVar106)) &&
                             (dVar115 = 1.0, iVar106 <= local_114c)))))) goto LAB_006375bf;
                      }
                      else {
                        dVar116 = local_6b8[iVar38 + iVar43];
                        dVar14 = local_6b8[iVar38 + 1 + iVar43];
                        if ((dVar116 == 1.0) && (!NAN(dVar116))) {
                          dVar115 = 1.0;
                          if ((dVar14 == 1.0) && (!NAN(dVar14))) goto LAB_006375bf;
                        }
                        if ((dVar116 == -1.0) && (!NAN(dVar116))) {
                          dVar115 = -1.0;
                          if ((dVar14 == -1.0) && (!NAN(dVar14))) goto LAB_006375bf;
                        }
                        dVar115 = (double)(~-(ulong)(dVar116 == -1.0) &
                                          (-(ulong)(dVar116 == 1.0) & 0xbfd0000000000000 |
                                          ~-(ulong)(dVar116 == 1.0) & (ulong)(dVar116 * 0.5 + -0.25)
                                          ));
                        dVar116 = (double)(~-(ulong)(dVar14 == -1.0) &
                                          (-(ulong)(dVar14 == 1.0) & 0x3fd0000000000000 |
                                          ~-(ulong)(dVar14 == 1.0) & (ulong)(dVar14 * 0.5 + 0.25)));
                        dVar115 = (dVar116 * dVar116 - dVar115 * dVar115) /
                                  ((dVar116 - dVar115) + 1e-30);
                        if (dVar115 <= -0.5) {
                          dVar115 = -0.5;
                        }
                        if (0.5 <= dVar115) {
                          dVar115 = 0.5;
                        }
LAB_006375bf:
                        local_670[(int)local_698 + iVar100] = dVar115;
                      }
                      if (((((iVar100 < iVar69) || (iVar30 < iVar100)) || (iVar17 < iVar78)) ||
                          ((local_e34 < iVar17 || (iVar106 < iVar87)))) || (iVar29 < iVar106)) {
                        if (((iVar110 <= iVar100) && (iVar100 <= iVar31)) &&
                           ((iVar79 <= iVar17 &&
                            (((iVar17 <= local_e4c && (iVar80 <= iVar106)) &&
                             (dVar115 = 1.0, iVar106 <= local_114c)))))) goto LAB_00637748;
                      }
                      else {
                        dVar116 = local_6c0[iVar38 + iVar54];
                        dVar14 = local_6c8[iVar38 + iVar54];
                        if ((dVar116 == 1.0) && (!NAN(dVar116))) {
                          dVar115 = 1.0;
                          if ((dVar14 == 1.0) && (!NAN(dVar14))) goto LAB_00637748;
                        }
                        if ((dVar116 == -1.0) && (!NAN(dVar116))) {
                          dVar115 = -1.0;
                          if ((dVar14 == -1.0) && (!NAN(dVar14))) goto LAB_00637748;
                        }
                        dVar116 = (double)(~-(ulong)(dVar116 == -1.0) &
                                          (-(ulong)(dVar116 == 1.0) & 0xbfd0000000000000 |
                                          ~-(ulong)(dVar116 == 1.0) & (ulong)(dVar116 * 0.5 + -0.25)
                                          ));
                        dVar115 = (double)(~-(ulong)(dVar14 == -1.0) &
                                          (-(ulong)(dVar14 == 1.0) & 0x3fd0000000000000 |
                                          ~-(ulong)(dVar14 == 1.0) & (ulong)(dVar14 * 0.5 + 0.25)));
                        dVar115 = (dVar115 * dVar115 - dVar116 * dVar116) /
                                  ((dVar115 - dVar116) + 1e-30);
                        if (dVar115 <= -0.5) {
                          dVar115 = -0.5;
                        }
                        if (0.5 <= dVar115) {
                          dVar115 = 0.5;
                        }
LAB_00637748:
                        local_678[(int)local_690 + iVar100] = dVar115;
                      }
                      if ((((iVar100 < iVar69) || (iVar30 < iVar100)) || (iVar17 < iVar78)) ||
                         (((iVar61 < iVar17 || (iVar106 < iVar87)) || (local_e48 < iVar106)))) {
                        if (((iVar110 <= iVar100) && (iVar100 <= iVar31)) &&
                           ((iVar79 <= iVar17 &&
                            (((iVar17 <= iVar73 && (iVar80 <= iVar106)) &&
                             (dVar115 = 1.0, iVar106 <= local_e54)))))) goto LAB_006378dc;
                      }
                      else {
                        dVar116 = local_6d0[(iVar38 + iVar82) + local_728];
                        dVar14 = local_6d0[(iVar38 + iVar82) + local_730];
                        if ((dVar116 == 1.0) && (!NAN(dVar116))) {
                          dVar115 = 1.0;
                          if ((dVar14 == 1.0) && (!NAN(dVar14))) goto LAB_006378dc;
                        }
                        if ((dVar116 == -1.0) && (!NAN(dVar116))) {
                          dVar115 = -1.0;
                          if ((dVar14 == -1.0) && (!NAN(dVar14))) goto LAB_006378dc;
                        }
                        dVar116 = (double)(~-(ulong)(dVar116 == -1.0) &
                                          (-(ulong)(dVar116 == 1.0) & 0xbfd0000000000000 |
                                          ~-(ulong)(dVar116 == 1.0) & (ulong)(dVar116 * 0.5 + -0.25)
                                          ));
                        dVar115 = (double)(~-(ulong)(dVar14 == -1.0) &
                                          (-(ulong)(dVar14 == 1.0) & 0x3fd0000000000000 |
                                          ~-(ulong)(dVar14 == 1.0) & (ulong)(dVar14 * 0.5 + 0.25)));
                        dVar115 = (dVar115 * dVar115 - dVar116 * dVar116) /
                                  ((dVar115 - dVar116) + 1e-30);
                        if (dVar115 <= -0.5) {
                          dVar115 = -0.5;
                        }
                        if (0.5 <= dVar115) {
                          dVar115 = 0.5;
                        }
LAB_006378dc:
                        local_680[(int)local_688 + iVar100] = dVar115;
                      }
                      if (uVar28 < uVar59) {
                        uVar28 = uVar59;
                      }
                      uVar102 = (ulong)(iVar100 + 1U);
                      iVar43 = iVar43 + 2;
                      iVar95 = iVar95 + 2;
                      iVar44 = iVar44 + 2;
                      iVar45 = iVar45 + 2;
                      iVar39 = iVar39 + 2;
                      iVar46 = iVar46 + 2;
                      iVar47 = iVar47 + 2;
                      iVar48 = iVar48 + 2;
                      iVar49 = iVar49 + 2;
                      iVar50 = iVar50 + 2;
                      iVar51 = iVar51 + 2;
                      iVar52 = iVar52 + 2;
                      iVar53 = iVar53 + 2;
                      iVar54 = iVar54 + 2;
                      iVar82 = iVar82 + 2;
                      uVar59 = uVar28;
                    } while ((uint)local_1160 != iVar100 + 1U);
                  }
                  bVar25 = iVar17 != local_1150;
                  uVar60 = (uint)uVar107;
                  iVar17 = iVar17 + 1;
                } while (bVar25);
              }
              uVar59 = uVar60 + 1;
            } while (uVar60 != local_f00);
          }
          uVar59 = local_f70;
          if ((int)local_f70 <= (int)uVar28) {
            uVar59 = uVar28;
          }
          MFIter::operator++((MFIter *)local_1068);
        } while ((int)local_1068._32_4_ < (int)local_1068._40_4_);
        uVar59 = (uint)(uVar59 != 0);
      }
      MFIter::~MFIter((MFIter *)local_1068);
      local_1068[0] = (char)uVar59;
      ParallelDescriptor::ReduceBoolOr((bool *)local_1068);
      uVar65 = local_1068[0];
      if ((bool)local_1068[0] == false) {
        buildCellFlag(this);
      }
    }
  }
  return (int)(byte)uVar65;
}

Assistant:

int
Level::coarsenFromFine (Level& fineLevel, bool fill_boundary)
{
    const BoxArray& fine_grids = fineLevel.m_grids;
    const BoxArray& fine_covered_grids = fineLevel.m_covered_grids;
    const DistributionMapping& fine_dmap = fineLevel.m_dmap;
    m_grids = amrex::coarsen(fine_grids,2);
    m_covered_grids = amrex::coarsen(fine_covered_grids, 2);
    m_dmap = fine_dmap;

    if (! (fine_grids.coarsenable(2,2) &&
           (fine_covered_grids.empty() || fine_covered_grids.coarsenable(2,2)))) {
        return 1;
    }

    auto const& f_levelset = fineLevel.m_levelset;
    m_levelset.define(amrex::convert(m_grids,IntVect::TheNodeVector()), m_dmap, 1, 0);
    int mvmc_error = 0;

    if (Gpu::notInLaunchRegion())
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:mvmc_error)
#endif
        for (MFIter mfi(m_levelset,true); mfi.isValid(); ++mfi)
        {
            const Box& ccbx = mfi.tilebox(IntVect::TheCellVector());
            const Box& ndbx = mfi.tilebox();
            auto const& crse = m_levelset.array(mfi);
            auto const& fine = f_levelset.const_array(mfi);

            amrex::LoopConcurrentOnCpu(ndbx,
            [=] (int i, int j, int k) noexcept
            {
                crse(i,j,k) = fine(2*i,2*j,2*k);
            });

            int tile_error = 0;
            amrex::LoopOnCpu(ccbx,
            [=,&tile_error] (int i, int j, int k) noexcept
            {
                int ierror = check_mvmc(i,j,k,fine);
                tile_error = std::max(tile_error,ierror);
            });

            mvmc_error = std::max(mvmc_error, tile_error);
        }
    }
    else
    {
        ReduceOps<ReduceOpMax> reduce_op;
        ReduceData<int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;

        for (MFIter mfi(m_levelset); mfi.isValid(); ++mfi)
        {
            const Box& ndbx = mfi.validbox();
            const Box& ccbx = amrex::enclosedCells(ndbx);
            auto const& crse = m_levelset.array(mfi);
            auto const& fine = f_levelset.const_array(mfi);
            reduce_op.eval(ndbx, reduce_data,
            [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
            {
                crse(i,j,k) = fine(2*i,2*j,2*k);
                int ierror;
                if (ccbx.contains(IntVect{AMREX_D_DECL(i,j,k)})) {
                    ierror = check_mvmc(i,j,k,fine);
                } else {
                    ierror = 0;
                }
                return {ierror};
            });
        }
        ReduceTuple rv = reduce_data.value(reduce_op);
        mvmc_error = amrex::max(0, amrex::get<0>(rv));
    }

    {
        bool b = mvmc_error;
        ParallelDescriptor::ReduceBoolOr(b);
        mvmc_error = b;
    }
    if (mvmc_error) return mvmc_error;

    const int ng = 2;
    m_cellflag.define(m_grids, m_dmap, 1, ng);
    m_volfrac.define(m_grids, m_dmap, 1, ng);
    m_centroid.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    m_bndryarea.define(m_grids, m_dmap, 1, ng);
    m_bndrycent.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    m_bndrynorm.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, 1, ng);
        m_facecent[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, AMREX_SPACEDIM-1, ng);
        IntVect edge_type{1}; edge_type[idim] = 0;
        m_edgecent[idim].define(amrex::convert(m_grids, edge_type), m_dmap, 1, ng);
    }

    auto& f_cellflag = fineLevel.m_cellflag;
    MultiFab& f_volfrac = fineLevel.m_volfrac;
    MultiFab& f_centroid = fineLevel.m_centroid;
    MultiFab& f_bndryarea = fineLevel.m_bndryarea;
    MultiFab& f_bndrycent = fineLevel.m_bndrycent;
    MultiFab& f_bndrynorm = fineLevel.m_bndrynorm;
    auto& f_areafrac = fineLevel.m_areafrac;
    auto& f_facecent = fineLevel.m_facecent;
    auto& f_edgecent = fineLevel.m_edgecent;

    if (fill_boundary)
    {
        const Geometry& fine_geom = fineLevel.m_geom;
        const auto& fine_period = fine_geom.periodicity();
        f_cellflag.FillBoundary(fine_period);
        f_volfrac.FillBoundary(fine_period);
        f_centroid.FillBoundary(fine_period);
        f_bndryarea.FillBoundary(fine_period);
        f_bndrycent.FillBoundary(fine_period);
        f_bndrynorm.FillBoundary(fine_period);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            f_areafrac[idim].FillBoundary(fine_period);
            f_facecent[idim].FillBoundary(fine_period);
            f_edgecent[idim].FillBoundary(fine_period);
        }

        if (!fine_covered_grids.empty())
        {
            const std::vector<IntVect>& pshifts = fine_period.shiftIntVect();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            {
                std::vector<std::pair<int,Box> > isects;
                for (MFIter mfi(f_volfrac); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.fabbox();
                    auto const& vfrac = f_volfrac.array(mfi);
                    auto const& cflag = f_cellflag.array(mfi);
                    AMREX_D_TERM(auto const& apx = f_areafrac[0].array(mfi);,
                                 auto const& apy = f_areafrac[1].array(mfi);,
                                 auto const& apz = f_areafrac[2].array(mfi););

                    for (const auto& iv : pshifts)
                    {
                        fine_covered_grids.intersections(bx+iv, isects);
                        for (const auto& is : isects)
                        {
                            Box const& ibox = is.second - iv;
                            Box const& indbox = amrex::surroundingNodes(ibox);
                            AMREX_D_TERM(auto const& xbx = amrex::surroundingNodes(ibox,0);,
                                         auto const& ybx = amrex::surroundingNodes(ibox,1);,
                                         auto const& zbx = amrex::surroundingNodes(ibox,2););
                            AMREX_HOST_DEVICE_FOR_3D(indbox, i,j,k,
                            {
                                IntVect cell(AMREX_D_DECL(i,j,k));
                                if (ibox.contains(cell)) {
                                    vfrac(i,j,k) = 0.0;
                                    cflag(i,j,k) = EBCellFlag::TheCoveredCell();
                                }
                                AMREX_D_TERM(if (xbx.contains(cell)) apx(i,j,k) = 0.0;,
                                             if (ybx.contains(cell)) apy(i,j,k) = 0.0;,
                                             if (zbx.contains(cell)) apz(i,j,k) = 0.0;);
                            });
                        }
                    }
                }
            }
        }
    }

    int error = 0;

    if (Gpu::notInLaunchRegion())
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:error)
#endif
        for (MFIter mfi(m_volfrac,true); mfi.isValid(); ++mfi)
        {
            auto const& cvol = m_volfrac.array(mfi);
            auto const& ccent = m_centroid.array(mfi);
            auto const& cba = m_bndryarea.array(mfi);
            auto const& cbc = m_bndrycent.array(mfi);
            auto const& cbn = m_bndrynorm.array(mfi);
            AMREX_D_TERM(auto const& capx = m_areafrac[0].array(mfi);,
                         auto const& capy = m_areafrac[1].array(mfi);,
                         auto const& capz = m_areafrac[2].array(mfi););
            AMREX_D_TERM(auto const& cfcx = m_facecent[0].array(mfi);,
                         auto const& cfcy = m_facecent[1].array(mfi);,
                         auto const& cfcz = m_facecent[2].array(mfi););
            AMREX_D_TERM(auto const& cecx = m_edgecent[0].array(mfi);,
                         auto const& cecy = m_edgecent[1].array(mfi);,
                         auto const& cecz = m_edgecent[2].array(mfi););
            auto const& cflag = m_cellflag.array(mfi);

            auto const& fvol = f_volfrac.const_array(mfi);
            auto const& fcent = f_centroid.const_array(mfi);
            auto const& fba = f_bndryarea.const_array(mfi);
            auto const& fbc = f_bndrycent.const_array(mfi);
            auto const& fbn = f_bndrynorm.const_array(mfi);
            AMREX_D_TERM(auto const& fapx = f_areafrac[0].const_array(mfi);,
                         auto const& fapy = f_areafrac[1].const_array(mfi);,
                         auto const& fapz = f_areafrac[2].const_array(mfi););
            AMREX_D_TERM(auto const& ffcx = f_facecent[0].const_array(mfi);,
                         auto const& ffcy = f_facecent[1].const_array(mfi);,
                         auto const& ffcz = f_facecent[2].const_array(mfi););
            AMREX_D_TERM(auto const& fecx = f_edgecent[0].const_array(mfi);,
                         auto const& fecy = f_edgecent[1].const_array(mfi);,
                         auto const& fecz = f_edgecent[2].const_array(mfi););
            auto const& fflag = f_cellflag.const_array(mfi);

            Box const& bx = mfi.validbox();
            Box const& ndgbx = mfi.grownnodaltilebox(-1,2);

            int tile_error = 0;
            amrex::LoopOnCpu(ndgbx,
            [=,&tile_error] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                int ierr = coarsen_from_fine(AMREX_D_DECL(i,j,k), bx, 2,
                                             cvol,ccent,cba,cbc,cbn,
                                             AMREX_D_DECL(capx,capy,capz),
                                             AMREX_D_DECL(cfcx,cfcy,cfcz),
                                             AMREX_D_DECL(cecx,cecy,cecz),
                                             cflag,fvol,fcent,fba,fbc,fbn,
                                             AMREX_D_DECL(fapx,fapy,fapz),
                                             AMREX_D_DECL(ffcx,ffcy,ffcz),
                                             AMREX_D_DECL(fecx,fecy,fecz),
                                             fflag);
                tile_error = std::max(tile_error,ierr);
            });

            error = std::max(error,tile_error);
        }
    }
    else
    {
        ReduceOps<ReduceOpMax> reduce_op;
        ReduceData<int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;

        for (MFIter mfi(m_volfrac); mfi.isValid(); ++mfi)
        {
            auto const& cvol = m_volfrac.array(mfi);
            auto const& ccent = m_centroid.array(mfi);
            auto const& cba = m_bndryarea.array(mfi);
            auto const& cbc = m_bndrycent.array(mfi);
            auto const& cbn = m_bndrynorm.array(mfi);
            AMREX_D_TERM(auto const& capx = m_areafrac[0].array(mfi);,
                         auto const& capy = m_areafrac[1].array(mfi);,
                         auto const& capz = m_areafrac[2].array(mfi););
            AMREX_D_TERM(auto const& cfcx = m_facecent[0].array(mfi);,
                         auto const& cfcy = m_facecent[1].array(mfi);,
                         auto const& cfcz = m_facecent[2].array(mfi););
            AMREX_D_TERM(auto const& cecx = m_edgecent[0].array(mfi);,
                         auto const& cecy = m_edgecent[1].array(mfi);,
                         auto const& cecz = m_edgecent[2].array(mfi););
            auto const& cflag = m_cellflag.array(mfi);

            auto const& fvol = f_volfrac.const_array(mfi);
            auto const& fcent = f_centroid.const_array(mfi);
            auto const& fba = f_bndryarea.const_array(mfi);
            auto const& fbc = f_bndrycent.const_array(mfi);
            auto const& fbn = f_bndrynorm.const_array(mfi);
            AMREX_D_TERM(auto const& fapx = f_areafrac[0].const_array(mfi);,
                         auto const& fapy = f_areafrac[1].const_array(mfi);,
                         auto const& fapz = f_areafrac[2].const_array(mfi););
            AMREX_D_TERM(auto const& ffcx = f_facecent[0].const_array(mfi);,
                         auto const& ffcy = f_facecent[1].const_array(mfi);,
                         auto const& ffcz = f_facecent[2].const_array(mfi););
            AMREX_D_TERM(auto const& fecx = f_edgecent[0].const_array(mfi);,
                         auto const& fecy = f_edgecent[1].const_array(mfi);,
                         auto const& fecz = f_edgecent[2].const_array(mfi););
            auto const& fflag = f_cellflag.const_array(mfi);

            Box const& bx = mfi.validbox();
            Box const& gbx = amrex::grow(bx,2);
            Box const& ndgbx = amrex::surroundingNodes(gbx);

            reduce_op.eval(ndgbx, reduce_data,
            [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
            {
                amrex::ignore_unused(j,k);
                int ierr = coarsen_from_fine(AMREX_D_DECL(i,j,k), bx, 2,
                                             cvol,ccent,cba,cbc,cbn,
                                             AMREX_D_DECL(capx,capy,capz),
                                             AMREX_D_DECL(cfcx,cfcy,cfcz),
                                             AMREX_D_DECL(cecx,cecy,cecz),
                                             cflag,fvol,fcent,fba,fbc,fbn,
                                             AMREX_D_DECL(fapx,fapy,fapz),
                                             AMREX_D_DECL(ffcx,ffcy,ffcz),
                                             AMREX_D_DECL(fecx,fecy,fecz),
                                             fflag);
                return {ierr};
            });
        }

        ReduceTuple rv = reduce_data.value(reduce_op);
        error = amrex::max(0, amrex::get<0>(rv));
    }

    {
        bool b = error;
        ParallelDescriptor::ReduceBoolOr(b);
        error = b;
    }

    if (!error) {
        buildCellFlag();
    }

    return error;
}